

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<4,8>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [28];
  undefined1 auVar26 [28];
  undefined1 auVar27 [28];
  undefined1 auVar28 [28];
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  byte bVar36;
  uint uVar37;
  ulong uVar38;
  uint uVar40;
  long lVar41;
  ulong uVar42;
  uint uVar43;
  ulong uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  int iVar107;
  float fVar108;
  vint4 bi_2;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined4 uVar111;
  vint4 bi_1;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  float fVar125;
  float fVar133;
  float fVar134;
  vint4 bi;
  float fVar135;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar150;
  float fVar158;
  vint4 ai_2;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  vint4 ai;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  vint4 ai_1;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  vfloat4 a0_2;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  float fVar212;
  float fVar223;
  float fVar224;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar225;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar226;
  float fVar227;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar234;
  float fVar243;
  float fVar244;
  float fVar245;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar246;
  float fVar253;
  float fVar254;
  vfloat4 a0;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar255;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  vfloat4 a0_1;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  int iVar267;
  undefined1 in_ZMM29 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_490;
  undefined1 local_460 [16];
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  uint auStack_410 [4];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  undefined1 local_330 [16];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  uint uStack_260;
  float afStack_25c [7];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar39;
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  uint uVar106;
  
  PVar3 = prim[1];
  uVar42 = (ulong)(byte)PVar3;
  fVar108 = *(float *)(prim + uVar42 * 0x19 + 0x12);
  auVar45 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar46 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar46 = vinsertps_avx(auVar46,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar45 = vsubps_avx(auVar45,*(undefined1 (*) [16])(prim + uVar42 * 0x19 + 6));
  auVar66._0_4_ = fVar108 * auVar45._0_4_;
  auVar66._4_4_ = fVar108 * auVar45._4_4_;
  auVar66._8_4_ = fVar108 * auVar45._8_4_;
  auVar66._12_4_ = fVar108 * auVar45._12_4_;
  auVar52._0_4_ = fVar108 * auVar46._0_4_;
  auVar52._4_4_ = fVar108 * auVar46._4_4_;
  auVar52._8_4_ = fVar108 * auVar46._8_4_;
  auVar52._12_4_ = fVar108 * auVar46._12_4_;
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar42 * 4 + 6)));
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar46 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar42 * 5 + 6)));
  auVar46 = vcvtdq2ps_avx(auVar46);
  auVar47 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar42 * 6 + 6)));
  auVar58 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar42 * 0xb + 6)));
  auVar47 = vcvtdq2ps_avx(auVar47);
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar57 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar56 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar42 + 6)));
  auVar56 = vcvtdq2ps_avx(auVar56);
  uVar44 = (ulong)(uint)((int)(uVar42 * 9) * 2);
  auVar55 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar44 + 6)));
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar54 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar44 + uVar42 + 6)));
  auVar54 = vcvtdq2ps_avx(auVar54);
  uVar38 = (ulong)(uint)((int)(uVar42 * 5) << 2);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar38 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar247._4_4_ = auVar52._0_4_;
  auVar247._0_4_ = auVar52._0_4_;
  auVar247._8_4_ = auVar52._0_4_;
  auVar247._12_4_ = auVar52._0_4_;
  auVar50 = vshufps_avx(auVar52,auVar52,0x55);
  auVar48 = vshufps_avx(auVar52,auVar52,0xaa);
  fVar108 = auVar48._0_4_;
  auVar63._0_4_ = fVar108 * auVar47._0_4_;
  fVar227 = auVar48._4_4_;
  auVar63._4_4_ = fVar227 * auVar47._4_4_;
  fVar212 = auVar48._8_4_;
  auVar63._8_4_ = fVar212 * auVar47._8_4_;
  fVar223 = auVar48._12_4_;
  auVar63._12_4_ = fVar223 * auVar47._12_4_;
  auVar60._0_4_ = auVar56._0_4_ * fVar108;
  auVar60._4_4_ = auVar56._4_4_ * fVar227;
  auVar60._8_4_ = auVar56._8_4_ * fVar212;
  auVar60._12_4_ = auVar56._12_4_ * fVar223;
  auVar53._0_4_ = auVar18._0_4_ * fVar108;
  auVar53._4_4_ = auVar18._4_4_ * fVar227;
  auVar53._8_4_ = auVar18._8_4_ * fVar212;
  auVar53._12_4_ = auVar18._12_4_ * fVar223;
  auVar48 = vfmadd231ps_fma(auVar63,auVar50,auVar46);
  auVar49 = vfmadd231ps_fma(auVar60,auVar50,auVar57);
  auVar50 = vfmadd231ps_fma(auVar53,auVar54,auVar50);
  auVar51 = vfmadd231ps_fma(auVar48,auVar247,auVar45);
  auVar49 = vfmadd231ps_fma(auVar49,auVar247,auVar58);
  auVar52 = vfmadd231ps_fma(auVar50,auVar55,auVar247);
  auVar248._4_4_ = auVar66._0_4_;
  auVar248._0_4_ = auVar66._0_4_;
  auVar248._8_4_ = auVar66._0_4_;
  auVar248._12_4_ = auVar66._0_4_;
  auVar50 = vshufps_avx(auVar66,auVar66,0x55);
  auVar48 = vshufps_avx(auVar66,auVar66,0xaa);
  fVar108 = auVar48._0_4_;
  auVar260._0_4_ = fVar108 * auVar47._0_4_;
  fVar227 = auVar48._4_4_;
  auVar260._4_4_ = fVar227 * auVar47._4_4_;
  fVar212 = auVar48._8_4_;
  auVar260._8_4_ = fVar212 * auVar47._8_4_;
  fVar223 = auVar48._12_4_;
  auVar260._12_4_ = fVar223 * auVar47._12_4_;
  auVar62._0_4_ = auVar56._0_4_ * fVar108;
  auVar62._4_4_ = auVar56._4_4_ * fVar227;
  auVar62._8_4_ = auVar56._8_4_ * fVar212;
  auVar62._12_4_ = auVar56._12_4_ * fVar223;
  auVar61._0_4_ = auVar18._0_4_ * fVar108;
  auVar61._4_4_ = auVar18._4_4_ * fVar227;
  auVar61._8_4_ = auVar18._8_4_ * fVar212;
  auVar61._12_4_ = auVar18._12_4_ * fVar223;
  auVar46 = vfmadd231ps_fma(auVar260,auVar50,auVar46);
  auVar47 = vfmadd231ps_fma(auVar62,auVar50,auVar57);
  auVar57 = vfmadd231ps_fma(auVar61,auVar50,auVar54);
  auVar56 = vfmadd231ps_fma(auVar46,auVar248,auVar45);
  auVar54 = vfmadd231ps_fma(auVar47,auVar248,auVar58);
  auVar82._16_16_ = in_YmmResult._16_16_;
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar265 = ZEXT1664(auVar45);
  auVar18 = vfmadd231ps_fma(auVar57,auVar248,auVar55);
  auVar46 = vandps_avx512vl(auVar51,auVar45);
  auVar169._8_4_ = 0x219392ef;
  auVar169._0_8_ = 0x219392ef219392ef;
  auVar169._12_4_ = 0x219392ef;
  uVar44 = vcmpps_avx512vl(auVar46,auVar169,1);
  bVar10 = (bool)((byte)uVar44 & 1);
  auVar48._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar51._0_4_;
  bVar10 = (bool)((byte)(uVar44 >> 1) & 1);
  auVar48._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar51._4_4_;
  bVar10 = (bool)((byte)(uVar44 >> 2) & 1);
  auVar48._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar51._8_4_;
  bVar10 = (bool)((byte)(uVar44 >> 3) & 1);
  auVar48._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar51._12_4_;
  auVar46 = vandps_avx512vl(auVar49,auVar45);
  uVar44 = vcmpps_avx512vl(auVar46,auVar169,1);
  bVar10 = (bool)((byte)uVar44 & 1);
  auVar51._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar49._0_4_;
  bVar10 = (bool)((byte)(uVar44 >> 1) & 1);
  auVar51._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar49._4_4_;
  bVar10 = (bool)((byte)(uVar44 >> 2) & 1);
  auVar51._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar49._8_4_;
  bVar10 = (bool)((byte)(uVar44 >> 3) & 1);
  auVar51._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar49._12_4_;
  auVar45 = vandps_avx512vl(auVar52,auVar45);
  uVar44 = vcmpps_avx512vl(auVar45,auVar169,1);
  bVar10 = (bool)((byte)uVar44 & 1);
  auVar49._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar52._0_4_;
  bVar10 = (bool)((byte)(uVar44 >> 1) & 1);
  auVar49._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar52._4_4_;
  bVar10 = (bool)((byte)(uVar44 >> 2) & 1);
  auVar49._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar52._8_4_;
  bVar10 = (bool)((byte)(uVar44 >> 3) & 1);
  auVar49._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar52._12_4_;
  auVar45 = vrcp14ps_avx512vl(auVar48);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar266 = ZEXT1664(auVar46);
  auVar47 = vfnmadd213ps_avx512vl(auVar48,auVar45,auVar46);
  auVar58 = vfmadd132ps_fma(auVar47,auVar45,auVar45);
  auVar45 = vrcp14ps_avx512vl(auVar51);
  auVar47 = vfnmadd213ps_avx512vl(auVar51,auVar45,auVar46);
  auVar57 = vfmadd132ps_fma(auVar47,auVar45,auVar45);
  auVar45 = vrcp14ps_avx512vl(auVar49);
  auVar46 = vfnmadd213ps_avx512vl(auVar49,auVar45,auVar46);
  auVar55 = vfmadd132ps_fma(auVar46,auVar45,auVar45);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar42 * 7 + 6);
  auVar45 = vpmovsxwd_avx(auVar45);
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar45 = vsubps_avx(auVar45,auVar56);
  auVar159._0_4_ = auVar58._0_4_ * auVar45._0_4_;
  auVar159._4_4_ = auVar58._4_4_ * auVar45._4_4_;
  auVar159._8_4_ = auVar58._8_4_ * auVar45._8_4_;
  auVar159._12_4_ = auVar58._12_4_ * auVar45._12_4_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar42 * 9 + 6);
  auVar45 = vpmovsxwd_avx(auVar46);
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar45 = vsubps_avx(auVar45,auVar56);
  auVar48 = vpbroadcastd_avx512vl();
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar46 = vpmovsxwd_avx(auVar47);
  auVar64._0_4_ = auVar58._0_4_ * auVar45._0_4_;
  auVar64._4_4_ = auVar58._4_4_ * auVar45._4_4_;
  auVar64._8_4_ = auVar58._8_4_ * auVar45._8_4_;
  auVar64._12_4_ = auVar58._12_4_ * auVar45._12_4_;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar42 * -2 + 6);
  auVar45 = vpmovsxwd_avx(auVar58);
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar45 = vsubps_avx(auVar45,auVar54);
  auVar67._0_4_ = auVar57._0_4_ * auVar45._0_4_;
  auVar67._4_4_ = auVar57._4_4_ * auVar45._4_4_;
  auVar67._8_4_ = auVar57._8_4_ * auVar45._8_4_;
  auVar67._12_4_ = auVar57._12_4_ * auVar45._12_4_;
  auVar45 = vcvtdq2ps_avx(auVar46);
  auVar45 = vsubps_avx(auVar45,auVar54);
  auVar65._0_4_ = auVar57._0_4_ * auVar45._0_4_;
  auVar65._4_4_ = auVar57._4_4_ * auVar45._4_4_;
  auVar65._8_4_ = auVar57._8_4_ * auVar45._8_4_;
  auVar65._12_4_ = auVar57._12_4_ * auVar45._12_4_;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar38 + uVar42 + 6);
  auVar45 = vpmovsxwd_avx(auVar57);
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar45 = vsubps_avx(auVar45,auVar18);
  auVar68._0_4_ = auVar55._0_4_ * auVar45._0_4_;
  auVar68._4_4_ = auVar55._4_4_ * auVar45._4_4_;
  auVar68._8_4_ = auVar55._8_4_ * auVar45._8_4_;
  auVar68._12_4_ = auVar55._12_4_ * auVar45._12_4_;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar42 * 0x17 + 6);
  auVar45 = vpmovsxwd_avx(auVar56);
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar45 = vsubps_avx(auVar45,auVar18);
  auVar59._0_4_ = auVar55._0_4_ * auVar45._0_4_;
  auVar59._4_4_ = auVar55._4_4_ * auVar45._4_4_;
  auVar59._8_4_ = auVar55._8_4_ * auVar45._8_4_;
  auVar59._12_4_ = auVar55._12_4_ * auVar45._12_4_;
  auVar45 = vpminsd_avx(auVar159,auVar64);
  auVar46 = vpminsd_avx(auVar67,auVar65);
  auVar45 = vmaxps_avx(auVar45,auVar46);
  auVar46 = vpminsd_avx(auVar68,auVar59);
  uVar111 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar55._4_4_ = uVar111;
  auVar55._0_4_ = uVar111;
  auVar55._8_4_ = uVar111;
  auVar55._12_4_ = uVar111;
  auVar46 = vmaxps_avx512vl(auVar46,auVar55);
  auVar45 = vmaxps_avx(auVar45,auVar46);
  auVar54._8_4_ = 0x3f7ffffa;
  auVar54._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar54._12_4_ = 0x3f7ffffa;
  local_3d0 = vmulps_avx512vl(auVar45,auVar54);
  auVar45 = vpmaxsd_avx(auVar159,auVar64);
  auVar46 = vpmaxsd_avx(auVar67,auVar65);
  auVar45 = vminps_avx(auVar45,auVar46);
  auVar46 = vpmaxsd_avx(auVar68,auVar59);
  uVar111 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar18._4_4_ = uVar111;
  auVar18._0_4_ = uVar111;
  auVar18._8_4_ = uVar111;
  auVar18._12_4_ = uVar111;
  auVar46 = vminps_avx512vl(auVar46,auVar18);
  auVar45 = vminps_avx(auVar45,auVar46);
  auVar50._8_4_ = 0x3f800003;
  auVar50._0_8_ = 0x3f8000033f800003;
  auVar50._12_4_ = 0x3f800003;
  auVar45 = vmulps_avx512vl(auVar45,auVar50);
  uVar19 = vcmpps_avx512vl(local_3d0,auVar45,2);
  uVar44 = vpcmpgtd_avx512vl(auVar48,_DAT_01ff0cf0);
  uVar44 = ((byte)uVar19 & 0xf) & uVar44;
  if ((char)uVar44 == '\0') {
    return;
  }
  local_240 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar269 = ZEXT1664(auVar45);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar263 = ZEXT1664(auVar45);
  auVar45 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
  auVar268 = ZEXT1664(auVar45);
LAB_01b76b8c:
  lVar41 = 0;
  for (uVar38 = uVar44; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
    lVar41 = lVar41 + 1;
  }
  uVar43 = *(uint *)(prim + 2);
  uVar4 = *(uint *)(prim + lVar41 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar43].ptr;
  uVar38 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar4);
  p_Var7 = pGVar6[1].intersectionFilterN;
  pvVar8 = pGVar6[2].userPtr;
  _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar45 = *(undefined1 (*) [16])(_Var9 + uVar38 * (long)pvVar8);
  auVar46 = *(undefined1 (*) [16])(_Var9 + (uVar38 + 1) * (long)pvVar8);
  auVar47 = *(undefined1 (*) [16])(_Var9 + (uVar38 + 2) * (long)pvVar8);
  auVar58 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar38 + 3));
  lVar41 = *(long *)&pGVar6[1].time_range.upper;
  auVar57 = *(undefined1 (*) [16])(lVar41 + (long)p_Var7 * uVar38);
  auVar56 = *(undefined1 (*) [16])(lVar41 + (long)p_Var7 * (uVar38 + 1));
  auVar55 = *(undefined1 (*) [16])(lVar41 + (long)p_Var7 * (uVar38 + 2));
  uVar44 = uVar44 - 1 & uVar44;
  auVar54 = *(undefined1 (*) [16])(lVar41 + (long)p_Var7 * (uVar38 + 3));
  if (uVar44 != 0) {
    uVar42 = uVar44 - 1 & uVar44;
    for (uVar38 = uVar44; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
    }
    if (uVar42 != 0) {
      for (; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar18 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar18 = vinsertps_avx(auVar18,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar108 = *(float *)(ray + k * 4 + 0x60);
  auVar60 = auVar269._0_16_;
  auVar48 = vmulps_avx512vl(auVar54,auVar60);
  auVar112._0_12_ = ZEXT812(0);
  auVar112._12_4_ = 0;
  auVar50 = vfmadd213ps_fma(auVar112,auVar55,auVar48);
  auVar113._0_4_ = auVar56._0_4_ + auVar50._0_4_;
  auVar113._4_4_ = auVar56._4_4_ + auVar50._4_4_;
  auVar113._8_4_ = auVar56._8_4_ + auVar50._8_4_;
  auVar113._12_4_ = auVar56._12_4_ + auVar50._12_4_;
  auVar49 = vfmadd231ps_avx512vl(auVar113,auVar57,auVar60);
  auVar76._0_16_ = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
  auVar50 = vmulps_avx512vl(auVar54,auVar76._0_16_);
  auVar59 = auVar263._0_16_;
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar55,auVar59);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar56,auVar76._0_16_);
  auVar51 = vfnmadd231ps_avx512vl(auVar50,auVar57,auVar59);
  auVar52 = vmulps_avx512vl(auVar58,auVar60);
  auVar50 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar47,auVar52);
  auVar249._0_4_ = auVar50._0_4_ + auVar46._0_4_;
  auVar249._4_4_ = auVar50._4_4_ + auVar46._4_4_;
  auVar249._8_4_ = auVar50._8_4_ + auVar46._8_4_;
  auVar249._12_4_ = auVar50._12_4_ + auVar46._12_4_;
  auVar50 = vfmadd231ps_avx512vl(auVar249,auVar45,auVar60);
  auVar53 = vmulps_avx512vl(auVar58,auVar76._0_16_);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar47,auVar59);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar46,auVar76._0_16_);
  auVar53 = vfnmadd231ps_avx512vl(auVar53,auVar45,auVar59);
  auVar136._0_4_ = auVar55._0_4_ + auVar48._0_4_;
  auVar136._4_4_ = auVar55._4_4_ + auVar48._4_4_;
  auVar136._8_4_ = auVar55._8_4_ + auVar48._8_4_;
  auVar136._12_4_ = auVar55._12_4_ + auVar48._12_4_;
  auVar48 = vfmadd231ps_avx512vl(auVar136,auVar56,auVar76._0_16_);
  auVar48 = vfmadd231ps_avx512vl(auVar48,auVar57,auVar60);
  auVar54 = vmulps_avx512vl(auVar54,auVar59);
  auVar55 = vfmadd231ps_avx512vl(auVar54,auVar76._0_16_,auVar55);
  auVar56 = vfnmadd231ps_avx512vl(auVar55,auVar59,auVar56);
  auVar55 = vfmadd231ps_avx512vl(auVar56,auVar76._0_16_,auVar57);
  auVar207._0_4_ = auVar52._0_4_ + auVar47._0_4_;
  auVar207._4_4_ = auVar52._4_4_ + auVar47._4_4_;
  auVar207._8_4_ = auVar52._8_4_ + auVar47._8_4_;
  auVar207._12_4_ = auVar52._12_4_ + auVar47._12_4_;
  auVar57 = vfmadd231ps_avx512vl(auVar207,auVar46,auVar76._0_16_);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar45,auVar60);
  auVar58 = vmulps_avx512vl(auVar58,auVar59);
  auVar47 = vfmadd231ps_avx512vl(auVar58,auVar76._0_16_,auVar47);
  auVar46 = vfnmadd231ps_avx512vl(auVar47,auVar59,auVar46);
  auVar56 = vfmadd231ps_avx512vl(auVar46,auVar76._0_16_,auVar45);
  auVar45 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar46 = vshufps_avx(auVar50,auVar50,0xc9);
  fVar125 = auVar51._0_4_;
  auVar170._0_4_ = fVar125 * auVar46._0_4_;
  fVar133 = auVar51._4_4_;
  auVar170._4_4_ = fVar133 * auVar46._4_4_;
  fVar134 = auVar51._8_4_;
  auVar170._8_4_ = fVar134 * auVar46._8_4_;
  fVar135 = auVar51._12_4_;
  auVar170._12_4_ = fVar135 * auVar46._12_4_;
  auVar46 = vfmsub231ps_fma(auVar170,auVar45,auVar50);
  auVar47 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar46 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar171._0_4_ = fVar125 * auVar46._0_4_;
  auVar171._4_4_ = fVar133 * auVar46._4_4_;
  auVar171._8_4_ = fVar134 * auVar46._8_4_;
  auVar171._12_4_ = fVar135 * auVar46._12_4_;
  auVar45 = vfmsub231ps_fma(auVar171,auVar45,auVar53);
  auVar58 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar45 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar46 = vshufps_avx(auVar57,auVar57,0xc9);
  fVar150 = auVar55._0_4_;
  auVar160._0_4_ = fVar150 * auVar46._0_4_;
  fVar158 = auVar55._4_4_;
  auVar160._4_4_ = fVar158 * auVar46._4_4_;
  fVar225 = auVar55._8_4_;
  auVar160._8_4_ = fVar225 * auVar46._8_4_;
  fVar226 = auVar55._12_4_;
  auVar160._12_4_ = fVar226 * auVar46._12_4_;
  auVar46 = vfmsub231ps_fma(auVar160,auVar45,auVar57);
  auVar57 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar46 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar208._0_4_ = auVar46._0_4_ * fVar150;
  auVar208._4_4_ = auVar46._4_4_ * fVar158;
  auVar208._8_4_ = auVar46._8_4_ * fVar225;
  auVar208._12_4_ = auVar46._12_4_ * fVar226;
  auVar46 = vfmsub231ps_fma(auVar208,auVar45,auVar56);
  auVar45 = vdpps_avx(auVar47,auVar47,0x7f);
  auVar56 = vshufps_avx(auVar46,auVar46,0xc9);
  fVar212 = auVar45._0_4_;
  auVar76._16_16_ = auVar82._16_16_;
  auVar84._4_28_ = auVar76._4_28_;
  auVar84._0_4_ = fVar212;
  auVar46 = vrsqrt14ss_avx512f(auVar76._0_16_,auVar84._0_16_);
  fVar227 = auVar46._0_4_;
  auVar54 = vmulss_avx512f(auVar45,ZEXT416(0xbf000000));
  auVar46 = vdpps_avx(auVar47,auVar58,0x7f);
  fVar227 = fVar227 * 1.5 + auVar54._0_4_ * fVar227 * fVar227 * fVar227;
  fVar234 = fVar227 * auVar47._0_4_;
  fVar243 = fVar227 * auVar47._4_4_;
  fVar244 = fVar227 * auVar47._8_4_;
  fVar245 = fVar227 * auVar47._12_4_;
  auVar213._0_4_ = auVar58._0_4_ * fVar212;
  auVar213._4_4_ = auVar58._4_4_ * fVar212;
  auVar213._8_4_ = auVar58._8_4_ * fVar212;
  auVar213._12_4_ = auVar58._12_4_ * fVar212;
  fVar212 = auVar46._0_4_;
  auVar181._0_4_ = fVar212 * auVar47._0_4_;
  auVar181._4_4_ = fVar212 * auVar47._4_4_;
  auVar181._8_4_ = fVar212 * auVar47._8_4_;
  auVar181._12_4_ = fVar212 * auVar47._12_4_;
  auVar47 = vsubps_avx(auVar213,auVar181);
  auVar46 = vrcp14ss_avx512f(auVar76._0_16_,auVar84._0_16_);
  auVar45 = vfnmadd213ss_avx512f(auVar45,auVar46,ZEXT416(0x40000000));
  fVar223 = auVar46._0_4_ * auVar45._0_4_;
  auVar45 = vdpps_avx(auVar57,auVar57,0x7f);
  fVar224 = auVar45._0_4_;
  auVar69._16_16_ = auVar82._16_16_;
  auVar69._0_16_ = auVar76._0_16_;
  auVar85._4_28_ = auVar69._4_28_;
  auVar85._0_4_ = fVar224;
  auVar46 = vrsqrt14ss_avx512f(auVar76._0_16_,auVar85._0_16_);
  fVar212 = auVar46._0_4_;
  auVar46 = vmulss_avx512f(auVar45,ZEXT416(0xbf000000));
  fVar212 = fVar212 * 1.5 + auVar46._0_4_ * fVar212 * fVar212 * fVar212;
  auVar46 = vdpps_avx(auVar57,auVar56,0x7f);
  fVar246 = fVar212 * auVar57._0_4_;
  fVar253 = fVar212 * auVar57._4_4_;
  fVar254 = fVar212 * auVar57._8_4_;
  fVar255 = fVar212 * auVar57._12_4_;
  auVar172._0_4_ = fVar224 * auVar56._0_4_;
  auVar172._4_4_ = fVar224 * auVar56._4_4_;
  auVar172._8_4_ = fVar224 * auVar56._8_4_;
  auVar172._12_4_ = fVar224 * auVar56._12_4_;
  fVar224 = auVar46._0_4_;
  auVar161._0_4_ = fVar224 * auVar57._0_4_;
  auVar161._4_4_ = fVar224 * auVar57._4_4_;
  auVar161._8_4_ = fVar224 * auVar57._8_4_;
  auVar161._12_4_ = fVar224 * auVar57._12_4_;
  auVar58 = vsubps_avx(auVar172,auVar161);
  auVar46 = vrcp14ss_avx512f(auVar76._0_16_,auVar85._0_16_);
  auVar45 = vfnmadd213ss_avx512f(auVar45,auVar46,ZEXT416(0x40000000));
  fVar224 = auVar45._0_4_ * auVar46._0_4_;
  auVar45 = vshufps_avx(auVar49,auVar49,0xff);
  auVar192._0_4_ = fVar234 * auVar45._0_4_;
  auVar192._4_4_ = fVar243 * auVar45._4_4_;
  auVar192._8_4_ = fVar244 * auVar45._8_4_;
  auVar192._12_4_ = fVar245 * auVar45._12_4_;
  local_310 = vsubps_avx(auVar49,auVar192);
  auVar46 = vshufps_avx(auVar51,auVar51,0xff);
  auVar173._0_4_ = auVar46._0_4_ * fVar234 + auVar45._0_4_ * fVar227 * fVar223 * auVar47._0_4_;
  auVar173._4_4_ = auVar46._4_4_ * fVar243 + auVar45._4_4_ * fVar227 * fVar223 * auVar47._4_4_;
  auVar173._8_4_ = auVar46._8_4_ * fVar244 + auVar45._8_4_ * fVar227 * fVar223 * auVar47._8_4_;
  auVar173._12_4_ = auVar46._12_4_ * fVar245 + auVar45._12_4_ * fVar227 * fVar223 * auVar47._12_4_;
  auVar47 = vsubps_avx(auVar51,auVar173);
  local_320._0_4_ = auVar192._0_4_ + auVar49._0_4_;
  local_320._4_4_ = auVar192._4_4_ + auVar49._4_4_;
  fStack_318 = auVar192._8_4_ + auVar49._8_4_;
  fStack_314 = auVar192._12_4_ + auVar49._12_4_;
  auVar45 = vshufps_avx(auVar48,auVar48,0xff);
  auVar174._0_4_ = fVar246 * auVar45._0_4_;
  auVar174._4_4_ = fVar253 * auVar45._4_4_;
  auVar174._8_4_ = fVar254 * auVar45._8_4_;
  auVar174._12_4_ = fVar255 * auVar45._12_4_;
  local_330 = vsubps_avx512vl(auVar48,auVar174);
  auVar46 = vshufps_avx(auVar55,auVar55,0xff);
  auVar126._0_4_ = auVar46._0_4_ * fVar246 + auVar45._0_4_ * fVar212 * auVar58._0_4_ * fVar224;
  auVar126._4_4_ = auVar46._4_4_ * fVar253 + auVar45._4_4_ * fVar212 * auVar58._4_4_ * fVar224;
  auVar126._8_4_ = auVar46._8_4_ * fVar254 + auVar45._8_4_ * fVar212 * auVar58._8_4_ * fVar224;
  auVar126._12_4_ = auVar46._12_4_ * fVar255 + auVar45._12_4_ * fVar212 * auVar58._12_4_ * fVar224;
  auVar45 = vsubps_avx(auVar55,auVar126);
  local_340._0_4_ = auVar48._0_4_ + auVar174._0_4_;
  local_340._4_4_ = auVar48._4_4_ + auVar174._4_4_;
  fStack_338 = auVar48._8_4_ + auVar174._8_4_;
  fStack_334 = auVar48._12_4_ + auVar174._12_4_;
  auVar137._0_4_ = auVar47._0_4_ * 0.33333334;
  auVar137._4_4_ = auVar47._4_4_ * 0.33333334;
  auVar137._8_4_ = auVar47._8_4_ * 0.33333334;
  auVar137._12_4_ = auVar47._12_4_ * 0.33333334;
  local_350 = vaddps_avx512vl(local_310,auVar137);
  auVar138._0_4_ = auVar45._0_4_ * 0.33333334;
  auVar138._4_4_ = auVar45._4_4_ * 0.33333334;
  auVar138._8_4_ = auVar45._8_4_ * 0.33333334;
  auVar138._12_4_ = auVar45._12_4_ * 0.33333334;
  local_360 = vsubps_avx512vl(local_330,auVar138);
  auVar114._0_4_ = (fVar125 + auVar173._0_4_) * 0.33333334;
  auVar114._4_4_ = (fVar133 + auVar173._4_4_) * 0.33333334;
  auVar114._8_4_ = (fVar134 + auVar173._8_4_) * 0.33333334;
  auVar114._12_4_ = (fVar135 + auVar173._12_4_) * 0.33333334;
  _local_370 = vaddps_avx512vl(_local_320,auVar114);
  auVar115._0_4_ = (fVar150 + auVar126._0_4_) * 0.33333334;
  auVar115._4_4_ = (fVar158 + auVar126._4_4_) * 0.33333334;
  auVar115._8_4_ = (fVar225 + auVar126._8_4_) * 0.33333334;
  auVar115._12_4_ = (fVar226 + auVar126._12_4_) * 0.33333334;
  _local_380 = vsubps_avx512vl(_local_340,auVar115);
  local_290 = vsubps_avx(local_310,auVar18);
  uVar111 = local_290._0_4_;
  auVar127._4_4_ = uVar111;
  auVar127._0_4_ = uVar111;
  auVar127._8_4_ = uVar111;
  auVar127._12_4_ = uVar111;
  auVar45 = vshufps_avx(local_290,local_290,0x55);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  auVar46 = vshufps_avx(local_290,local_290,0xaa);
  fVar227 = pre->ray_space[k].vz.field_0.m128[0];
  fVar212 = pre->ray_space[k].vz.field_0.m128[1];
  fVar223 = pre->ray_space[k].vz.field_0.m128[2];
  fVar224 = pre->ray_space[k].vz.field_0.m128[3];
  auVar116._0_4_ = fVar227 * auVar46._0_4_;
  auVar116._4_4_ = fVar212 * auVar46._4_4_;
  auVar116._8_4_ = fVar223 * auVar46._8_4_;
  auVar116._12_4_ = fVar224 * auVar46._12_4_;
  auVar45 = vfmadd231ps_fma(auVar116,(undefined1  [16])aVar2,auVar45);
  auVar55 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar1,auVar127);
  local_2a0 = vsubps_avx512vl(local_350,auVar18);
  uVar111 = local_2a0._0_4_;
  auVar139._4_4_ = uVar111;
  auVar139._0_4_ = uVar111;
  auVar139._8_4_ = uVar111;
  auVar139._12_4_ = uVar111;
  auVar45 = vshufps_avx(local_2a0,local_2a0,0x55);
  auVar46 = vshufps_avx(local_2a0,local_2a0,0xaa);
  auVar128._0_4_ = fVar227 * auVar46._0_4_;
  auVar128._4_4_ = fVar212 * auVar46._4_4_;
  auVar128._8_4_ = fVar223 * auVar46._8_4_;
  auVar128._12_4_ = fVar224 * auVar46._12_4_;
  auVar45 = vfmadd231ps_fma(auVar128,(undefined1  [16])aVar2,auVar45);
  auVar54 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar1,auVar139);
  local_2b0 = vsubps_avx512vl(local_360,auVar18);
  uVar111 = local_2b0._0_4_;
  auVar175._4_4_ = uVar111;
  auVar175._0_4_ = uVar111;
  auVar175._8_4_ = uVar111;
  auVar175._12_4_ = uVar111;
  auVar45 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar46 = vshufps_avx(local_2b0,local_2b0,0xaa);
  auVar140._0_4_ = fVar227 * auVar46._0_4_;
  auVar140._4_4_ = fVar212 * auVar46._4_4_;
  auVar140._8_4_ = fVar223 * auVar46._8_4_;
  auVar140._12_4_ = fVar224 * auVar46._12_4_;
  auVar45 = vfmadd231ps_fma(auVar140,(undefined1  [16])aVar2,auVar45);
  auVar50 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar1,auVar175);
  local_2c0 = vsubps_avx512vl(local_330,auVar18);
  uVar111 = local_2c0._0_4_;
  auVar193._4_4_ = uVar111;
  auVar193._0_4_ = uVar111;
  auVar193._8_4_ = uVar111;
  auVar193._12_4_ = uVar111;
  auVar45 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar46 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar176._0_4_ = fVar227 * auVar46._0_4_;
  auVar176._4_4_ = fVar212 * auVar46._4_4_;
  auVar176._8_4_ = fVar223 * auVar46._8_4_;
  auVar176._12_4_ = fVar224 * auVar46._12_4_;
  auVar45 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar2,auVar45);
  auVar48 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar1,auVar193);
  local_2d0 = vsubps_avx(_local_320,auVar18);
  uVar111 = local_2d0._0_4_;
  auVar194._4_4_ = uVar111;
  auVar194._0_4_ = uVar111;
  auVar194._8_4_ = uVar111;
  auVar194._12_4_ = uVar111;
  auVar45 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar46 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar214._0_4_ = auVar46._0_4_ * fVar227;
  auVar214._4_4_ = auVar46._4_4_ * fVar212;
  auVar214._8_4_ = auVar46._8_4_ * fVar223;
  auVar214._12_4_ = auVar46._12_4_ * fVar224;
  auVar45 = vfmadd231ps_fma(auVar214,(undefined1  [16])aVar2,auVar45);
  auVar49 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar1,auVar194);
  local_2e0 = vsubps_avx512vl(_local_370,auVar18);
  uVar111 = local_2e0._0_4_;
  auVar195._4_4_ = uVar111;
  auVar195._0_4_ = uVar111;
  auVar195._8_4_ = uVar111;
  auVar195._12_4_ = uVar111;
  auVar45 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar46 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar228._0_4_ = auVar46._0_4_ * fVar227;
  auVar228._4_4_ = auVar46._4_4_ * fVar212;
  auVar228._8_4_ = auVar46._8_4_ * fVar223;
  auVar228._12_4_ = auVar46._12_4_ * fVar224;
  auVar45 = vfmadd231ps_fma(auVar228,(undefined1  [16])aVar2,auVar45);
  auVar51 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar1,auVar195);
  local_2f0 = vsubps_avx512vl(_local_380,auVar18);
  uVar111 = local_2f0._0_4_;
  auVar196._4_4_ = uVar111;
  auVar196._0_4_ = uVar111;
  auVar196._8_4_ = uVar111;
  auVar196._12_4_ = uVar111;
  auVar45 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar46 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar235._0_4_ = auVar46._0_4_ * fVar227;
  auVar235._4_4_ = auVar46._4_4_ * fVar212;
  auVar235._8_4_ = auVar46._8_4_ * fVar223;
  auVar235._12_4_ = auVar46._12_4_ * fVar224;
  auVar45 = vfmadd231ps_fma(auVar235,(undefined1  [16])aVar2,auVar45);
  auVar52 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar1,auVar196);
  local_300 = vsubps_avx(_local_340,auVar18);
  uVar111 = local_300._0_4_;
  auVar109._4_4_ = uVar111;
  auVar109._0_4_ = uVar111;
  auVar109._8_4_ = uVar111;
  auVar109._12_4_ = uVar111;
  auVar45 = vshufps_avx(local_300,local_300,0x55);
  auVar46 = vshufps_avx(local_300,local_300,0xaa);
  auVar182._0_4_ = auVar46._0_4_ * fVar227;
  auVar182._4_4_ = auVar46._4_4_ * fVar212;
  auVar182._8_4_ = auVar46._8_4_ * fVar223;
  auVar182._12_4_ = auVar46._12_4_ * fVar224;
  auVar45 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar2,auVar45);
  auVar18 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar1,auVar109);
  auVar47 = vmovlhps_avx(auVar55,auVar49);
  auVar58 = vmovlhps_avx(auVar54,auVar51);
  auVar56 = vmovlhps_avx512f(auVar50,auVar52);
  _local_450 = vmovlhps_avx512f(auVar48,auVar18);
  auVar46 = vminps_avx(auVar47,auVar58);
  auVar45 = vmaxps_avx(auVar47,auVar58);
  auVar57 = vminps_avx512vl(auVar56,_local_450);
  auVar46 = vminps_avx(auVar46,auVar57);
  auVar57 = vmaxps_avx512vl(auVar56,_local_450);
  auVar45 = vmaxps_avx(auVar45,auVar57);
  auVar57 = vshufpd_avx(auVar46,auVar46,3);
  auVar46 = vminps_avx(auVar46,auVar57);
  auVar57 = vshufpd_avx(auVar45,auVar45,3);
  auVar45 = vmaxps_avx(auVar45,auVar57);
  auVar46 = vandps_avx512vl(auVar46,auVar265._0_16_);
  auVar45 = vandps_avx512vl(auVar45,auVar265._0_16_);
  auVar45 = vmaxps_avx(auVar46,auVar45);
  auVar46 = vmovshdup_avx(auVar45);
  auVar45 = vmaxss_avx(auVar46,auVar45);
  local_420 = vmovddup_avx512vl(auVar55);
  local_430 = vmovddup_avx512vl(auVar54);
  local_440 = vmovddup_avx512vl(auVar50);
  auVar117._8_8_ = auVar48._0_8_;
  auVar117._0_8_ = auVar48._0_8_;
  local_460 = ZEXT416((uint)(auVar45._0_4_ * 9.536743e-07));
  local_1c0 = vbroadcastss_avx512vl(local_460);
  auVar45 = vxorps_avx512vl(local_1c0._0_16_,auVar60);
  local_1e0 = vbroadcastss_avx512vl(auVar45);
  uVar38 = 0;
  auVar45 = vsubps_avx(auVar58,auVar47);
  local_270 = vsubps_avx512vl(auVar56,auVar58);
  local_280 = vsubps_avx512vl(_local_450,auVar56);
  local_390 = vsubps_avx(_local_320,local_310);
  local_3a0 = vsubps_avx512vl(_local_370,local_350);
  local_3b0 = vsubps_avx512vl(_local_380,local_360);
  _local_3c0 = vsubps_avx512vl(_local_340,local_330);
  local_200 = vpbroadcastd_avx512vl();
  local_220 = vpbroadcastd_avx512vl();
  auVar46 = ZEXT816(0x3f80000000000000);
  auVar262 = ZEXT1664(auVar46);
  do {
    auVar59 = auVar262._0_16_;
    auVar57 = vshufps_avx(auVar59,auVar59,0x50);
    auVar250._8_4_ = 0x3f800000;
    auVar250._0_8_ = &DAT_3f8000003f800000;
    auVar250._12_4_ = 0x3f800000;
    auVar155._16_4_ = 0x3f800000;
    auVar155._0_16_ = auVar250;
    auVar155._20_4_ = 0x3f800000;
    auVar155._24_4_ = 0x3f800000;
    auVar155._28_4_ = 0x3f800000;
    auVar55 = vsubps_avx(auVar250,auVar57);
    fVar227 = auVar57._0_4_;
    fVar125 = auVar49._0_4_;
    auVar141._0_4_ = fVar125 * fVar227;
    fVar212 = auVar57._4_4_;
    fVar133 = auVar49._4_4_;
    auVar141._4_4_ = fVar133 * fVar212;
    fVar223 = auVar57._8_4_;
    auVar141._8_4_ = fVar125 * fVar223;
    fVar224 = auVar57._12_4_;
    auVar141._12_4_ = fVar133 * fVar224;
    fVar150 = auVar51._0_4_;
    auVar151._0_4_ = fVar150 * fVar227;
    fVar158 = auVar51._4_4_;
    auVar151._4_4_ = fVar158 * fVar212;
    auVar151._8_4_ = fVar150 * fVar223;
    auVar151._12_4_ = fVar158 * fVar224;
    fVar243 = auVar52._0_4_;
    auVar162._0_4_ = fVar243 * fVar227;
    fVar244 = auVar52._4_4_;
    auVar162._4_4_ = fVar244 * fVar212;
    auVar162._8_4_ = fVar243 * fVar223;
    auVar162._12_4_ = fVar244 * fVar224;
    fVar134 = auVar18._0_4_;
    auVar118._0_4_ = fVar134 * fVar227;
    fVar135 = auVar18._4_4_;
    auVar118._4_4_ = fVar135 * fVar212;
    auVar118._8_4_ = fVar134 * fVar223;
    auVar118._12_4_ = fVar135 * fVar224;
    auVar54 = vfmadd231ps_avx512vl(auVar141,auVar55,local_420);
    auVar50 = vfmadd231ps_avx512vl(auVar151,auVar55,local_430);
    auVar48 = vfmadd231ps_avx512vl(auVar162,auVar55,local_440);
    auVar55 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar55);
    auVar57 = vmovshdup_avx(auVar46);
    fVar212 = auVar46._0_4_;
    fVar227 = (auVar57._0_4_ - fVar212) * 0.04761905;
    auVar83._4_4_ = fVar212;
    auVar83._0_4_ = fVar212;
    auVar83._8_4_ = fVar212;
    auVar83._12_4_ = fVar212;
    auVar83._16_4_ = fVar212;
    auVar83._20_4_ = fVar212;
    auVar83._24_4_ = fVar212;
    auVar83._28_4_ = fVar212;
    auVar77._0_8_ = auVar57._0_8_;
    auVar77._8_8_ = auVar77._0_8_;
    auVar77._16_8_ = auVar77._0_8_;
    auVar77._24_8_ = auVar77._0_8_;
    auVar82 = vsubps_avx(auVar77,auVar83);
    uVar111 = auVar54._0_4_;
    auVar88._4_4_ = uVar111;
    auVar88._0_4_ = uVar111;
    auVar88._8_4_ = uVar111;
    auVar88._12_4_ = uVar111;
    auVar88._16_4_ = uVar111;
    auVar88._20_4_ = uVar111;
    auVar88._24_4_ = uVar111;
    auVar88._28_4_ = uVar111;
    auVar78._8_4_ = 1;
    auVar78._0_8_ = 0x100000001;
    auVar78._12_4_ = 1;
    auVar78._16_4_ = 1;
    auVar78._20_4_ = 1;
    auVar78._24_4_ = 1;
    auVar78._28_4_ = 1;
    auVar85 = ZEXT1632(auVar54);
    auVar84 = vpermps_avx2(auVar78,auVar85);
    auVar69 = vbroadcastss_avx512vl(auVar50);
    auVar86 = ZEXT1632(auVar50);
    auVar70 = vpermps_avx512vl(auVar78,auVar86);
    auVar71 = vbroadcastss_avx512vl(auVar48);
    auVar79 = ZEXT1632(auVar48);
    auVar72 = vpermps_avx512vl(auVar78,auVar79);
    auVar73 = vbroadcastss_avx512vl(auVar55);
    auVar81 = ZEXT1632(auVar55);
    auVar74 = vpermps_avx512vl(auVar78,auVar81);
    auVar148._4_4_ = fVar227;
    auVar148._0_4_ = fVar227;
    auVar148._8_4_ = fVar227;
    auVar148._12_4_ = fVar227;
    auVar148._16_4_ = fVar227;
    auVar148._20_4_ = fVar227;
    auVar148._24_4_ = fVar227;
    auVar148._28_4_ = fVar227;
    auVar80._8_4_ = 2;
    auVar80._0_8_ = 0x200000002;
    auVar80._12_4_ = 2;
    auVar80._16_4_ = 2;
    auVar80._20_4_ = 2;
    auVar80._24_4_ = 2;
    auVar80._28_4_ = 2;
    auVar75 = vpermps_avx512vl(auVar80,auVar85);
    auVar76 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar77 = vpermps_avx512vl(auVar76,auVar85);
    auVar85 = vpermps_avx2(auVar80,auVar86);
    auVar78 = vpermps_avx512vl(auVar76,auVar86);
    auVar86 = vpermps_avx2(auVar80,auVar79);
    auVar79 = vpermps_avx512vl(auVar76,auVar79);
    auVar80 = vpermps_avx512vl(auVar80,auVar81);
    auVar81 = vpermps_avx512vl(auVar76,auVar81);
    auVar57 = vfmadd132ps_fma(auVar82,auVar83,_DAT_02020f20);
    auVar76 = vsubps_avx(auVar155,ZEXT1632(auVar57));
    auVar82 = vmulps_avx512vl(auVar69,ZEXT1632(auVar57));
    auVar87 = ZEXT1632(auVar57);
    auVar83 = vmulps_avx512vl(auVar70,auVar87);
    auVar55 = vfmadd231ps_fma(auVar82,auVar76,auVar88);
    auVar54 = vfmadd231ps_fma(auVar83,auVar76,auVar84);
    auVar82 = vmulps_avx512vl(auVar71,auVar87);
    auVar83 = vmulps_avx512vl(auVar72,auVar87);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar76,auVar69);
    auVar69 = vfmadd231ps_avx512vl(auVar83,auVar76,auVar70);
    auVar70 = vmulps_avx512vl(auVar73,auVar87);
    auVar88 = ZEXT1632(auVar57);
    auVar74 = vmulps_avx512vl(auVar74,auVar88);
    auVar83 = vfmadd231ps_avx512vl(auVar70,auVar76,auVar71);
    auVar74 = vfmadd231ps_avx512vl(auVar74,auVar76,auVar72);
    fVar223 = auVar57._0_4_;
    fVar224 = auVar57._4_4_;
    auVar70._4_4_ = fVar224 * auVar82._4_4_;
    auVar70._0_4_ = fVar223 * auVar82._0_4_;
    fVar225 = auVar57._8_4_;
    auVar70._8_4_ = fVar225 * auVar82._8_4_;
    fVar226 = auVar57._12_4_;
    auVar70._12_4_ = fVar226 * auVar82._12_4_;
    auVar70._16_4_ = auVar82._16_4_ * 0.0;
    auVar70._20_4_ = auVar82._20_4_ * 0.0;
    auVar70._24_4_ = auVar82._24_4_ * 0.0;
    auVar70._28_4_ = fVar212;
    auVar71._4_4_ = fVar224 * auVar69._4_4_;
    auVar71._0_4_ = fVar223 * auVar69._0_4_;
    auVar71._8_4_ = fVar225 * auVar69._8_4_;
    auVar71._12_4_ = fVar226 * auVar69._12_4_;
    auVar71._16_4_ = auVar69._16_4_ * 0.0;
    auVar71._20_4_ = auVar69._20_4_ * 0.0;
    auVar71._24_4_ = auVar69._24_4_ * 0.0;
    auVar71._28_4_ = auVar84._28_4_;
    auVar55 = vfmadd231ps_fma(auVar70,auVar76,ZEXT1632(auVar55));
    auVar54 = vfmadd231ps_fma(auVar71,auVar76,ZEXT1632(auVar54));
    auVar87._0_4_ = fVar223 * auVar83._0_4_;
    auVar87._4_4_ = fVar224 * auVar83._4_4_;
    auVar87._8_4_ = fVar225 * auVar83._8_4_;
    auVar87._12_4_ = fVar226 * auVar83._12_4_;
    auVar87._16_4_ = auVar83._16_4_ * 0.0;
    auVar87._20_4_ = auVar83._20_4_ * 0.0;
    auVar87._24_4_ = auVar83._24_4_ * 0.0;
    auVar87._28_4_ = 0;
    auVar72._4_4_ = fVar224 * auVar74._4_4_;
    auVar72._0_4_ = fVar223 * auVar74._0_4_;
    auVar72._8_4_ = fVar225 * auVar74._8_4_;
    auVar72._12_4_ = fVar226 * auVar74._12_4_;
    auVar72._16_4_ = auVar74._16_4_ * 0.0;
    auVar72._20_4_ = auVar74._20_4_ * 0.0;
    auVar72._24_4_ = auVar74._24_4_ * 0.0;
    auVar72._28_4_ = auVar83._28_4_;
    auVar50 = vfmadd231ps_fma(auVar87,auVar76,auVar82);
    auVar48 = vfmadd231ps_fma(auVar72,auVar76,auVar69);
    auVar74._28_4_ = auVar69._28_4_;
    auVar74._0_28_ =
         ZEXT1628(CONCAT412(fVar226 * auVar48._12_4_,
                            CONCAT48(fVar225 * auVar48._8_4_,
                                     CONCAT44(fVar224 * auVar48._4_4_,fVar223 * auVar48._0_4_))));
    auVar82._16_16_ =
         vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar226 * auVar50._12_4_,
                                            CONCAT48(fVar225 * auVar50._8_4_,
                                                     CONCAT44(fVar224 * auVar50._4_4_,
                                                              fVar223 * auVar50._0_4_)))),auVar76,
                         ZEXT1632(auVar55));
    auVar53 = vfmadd231ps_fma(auVar74,auVar76,ZEXT1632(auVar54));
    auVar84 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar55));
    auVar69 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar54));
    auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar84 = vmulps_avx512vl(auVar84,auVar70);
    auVar69 = vmulps_avx512vl(auVar69,auVar70);
    auVar89._0_4_ = fVar227 * auVar84._0_4_;
    auVar89._4_4_ = fVar227 * auVar84._4_4_;
    auVar89._8_4_ = fVar227 * auVar84._8_4_;
    auVar89._12_4_ = fVar227 * auVar84._12_4_;
    auVar89._16_4_ = fVar227 * auVar84._16_4_;
    auVar89._20_4_ = fVar227 * auVar84._20_4_;
    auVar89._24_4_ = fVar227 * auVar84._24_4_;
    auVar89._28_4_ = 0;
    auVar84 = vmulps_avx512vl(auVar148,auVar69);
    auVar50 = vxorps_avx512vl(auVar73._0_16_,auVar73._0_16_);
    auVar69 = vpermt2ps_avx512vl(ZEXT1632(auVar82._16_16_),_DAT_0205fd20,ZEXT1632(auVar50));
    auVar71 = vpermt2ps_avx512vl(ZEXT1632(auVar53),_DAT_0205fd20,ZEXT1632(auVar50));
    auVar124._0_4_ = auVar89._0_4_ + auVar82._16_4_;
    auVar124._4_4_ = auVar89._4_4_ + auVar82._20_4_;
    auVar124._8_4_ = auVar89._8_4_ + auVar82._24_4_;
    auVar124._12_4_ = auVar89._12_4_ + auVar82._28_4_;
    auVar124._16_4_ = auVar89._16_4_ + 0.0;
    auVar124._20_4_ = auVar89._20_4_ + 0.0;
    auVar124._24_4_ = auVar89._24_4_ + 0.0;
    auVar124._28_4_ = 0;
    auVar87 = ZEXT1632(auVar50);
    auVar72 = vpermt2ps_avx512vl(auVar89,_DAT_0205fd20,auVar87);
    auVar74 = vaddps_avx512vl(ZEXT1632(auVar53),auVar84);
    auVar73 = vpermt2ps_avx512vl(auVar84,_DAT_0205fd20,auVar87);
    auVar84 = vsubps_avx(auVar69,auVar72);
    auVar72 = vsubps_avx512vl(auVar71,auVar73);
    auVar73 = vmulps_avx512vl(auVar85,auVar88);
    auVar83 = vmulps_avx512vl(auVar78,auVar88);
    auVar73 = vfmadd231ps_avx512vl(auVar73,auVar76,auVar75);
    auVar75 = vfmadd231ps_avx512vl(auVar83,auVar76,auVar77);
    auVar77 = vmulps_avx512vl(auVar86,auVar88);
    auVar83 = vmulps_avx512vl(auVar79,auVar88);
    auVar85 = vfmadd231ps_avx512vl(auVar77,auVar76,auVar85);
    auVar77 = vfmadd231ps_avx512vl(auVar83,auVar76,auVar78);
    auVar78 = vmulps_avx512vl(auVar80,auVar88);
    auVar80 = vmulps_avx512vl(auVar81,auVar88);
    auVar55 = vfmadd231ps_fma(auVar78,auVar76,auVar86);
    auVar54 = vfmadd231ps_fma(auVar80,auVar76,auVar79);
    auVar78 = vmulps_avx512vl(auVar88,auVar85);
    auVar80 = vmulps_avx512vl(ZEXT1632(auVar57),auVar77);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar76,auVar73);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar76,auVar75);
    auVar85 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar226 * auVar55._12_4_,
                                            CONCAT48(fVar225 * auVar55._8_4_,
                                                     CONCAT44(fVar224 * auVar55._4_4_,
                                                              fVar223 * auVar55._0_4_)))),auVar76,
                         auVar85);
    auVar77 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar226 * auVar54._12_4_,
                                            CONCAT48(fVar225 * auVar54._8_4_,
                                                     CONCAT44(fVar224 * auVar54._4_4_,
                                                              fVar223 * auVar54._0_4_)))),auVar76,
                         auVar77);
    auVar73._4_4_ = fVar224 * auVar85._4_4_;
    auVar73._0_4_ = fVar223 * auVar85._0_4_;
    auVar73._8_4_ = fVar225 * auVar85._8_4_;
    auVar73._12_4_ = fVar226 * auVar85._12_4_;
    auVar73._16_4_ = auVar85._16_4_ * 0.0;
    auVar73._20_4_ = auVar85._20_4_ * 0.0;
    auVar73._24_4_ = auVar85._24_4_ * 0.0;
    auVar73._28_4_ = auVar79._28_4_;
    auVar75._4_4_ = fVar224 * auVar77._4_4_;
    auVar75._0_4_ = fVar223 * auVar77._0_4_;
    auVar75._8_4_ = fVar225 * auVar77._8_4_;
    auVar75._12_4_ = fVar226 * auVar77._12_4_;
    auVar75._16_4_ = auVar77._16_4_ * 0.0;
    auVar75._20_4_ = auVar77._20_4_ * 0.0;
    auVar75._24_4_ = auVar77._24_4_ * 0.0;
    auVar75._28_4_ = auVar86._28_4_;
    auVar73 = vfmadd231ps_avx512vl(auVar73,auVar76,auVar78);
    auVar75 = vfmadd231ps_avx512vl(auVar75,auVar80,auVar76);
    auVar76 = vsubps_avx512vl(auVar85,auVar78);
    auVar85 = vsubps_avx512vl(auVar77,auVar80);
    auVar76 = vmulps_avx512vl(auVar76,auVar70);
    auVar85 = vmulps_avx512vl(auVar85,auVar70);
    fVar212 = fVar227 * auVar76._0_4_;
    fVar223 = fVar227 * auVar76._4_4_;
    auVar86._4_4_ = fVar223;
    auVar86._0_4_ = fVar212;
    fVar224 = fVar227 * auVar76._8_4_;
    auVar86._8_4_ = fVar224;
    fVar225 = fVar227 * auVar76._12_4_;
    auVar86._12_4_ = fVar225;
    fVar226 = fVar227 * auVar76._16_4_;
    auVar86._16_4_ = fVar226;
    fVar234 = fVar227 * auVar76._20_4_;
    auVar86._20_4_ = fVar234;
    fVar227 = fVar227 * auVar76._24_4_;
    auVar86._24_4_ = fVar227;
    auVar86._28_4_ = auVar76._28_4_;
    auVar85 = vmulps_avx512vl(auVar148,auVar85);
    auVar70 = vpermt2ps_avx512vl(auVar73,_DAT_0205fd20,auVar87);
    auVar77 = vpermt2ps_avx512vl(auVar75,_DAT_0205fd20,auVar87);
    auVar211._0_4_ = auVar73._0_4_ + fVar212;
    auVar211._4_4_ = auVar73._4_4_ + fVar223;
    auVar211._8_4_ = auVar73._8_4_ + fVar224;
    auVar211._12_4_ = auVar73._12_4_ + fVar225;
    auVar211._16_4_ = auVar73._16_4_ + fVar226;
    auVar211._20_4_ = auVar73._20_4_ + fVar234;
    auVar211._24_4_ = auVar73._24_4_ + fVar227;
    auVar211._28_4_ = auVar73._28_4_ + auVar76._28_4_;
    auVar76 = vpermt2ps_avx512vl(auVar86,_DAT_0205fd20,ZEXT1632(auVar50));
    auVar86 = vaddps_avx512vl(auVar75,auVar85);
    auVar85 = vpermt2ps_avx512vl(auVar85,_DAT_0205fd20,ZEXT1632(auVar50));
    auVar76 = vsubps_avx(auVar70,auVar76);
    auVar85 = vsubps_avx512vl(auVar77,auVar85);
    auVar148 = ZEXT1632(auVar82._16_16_);
    auVar82 = vsubps_avx512vl(auVar73,auVar148);
    auVar155 = ZEXT1632(auVar53);
    auVar78 = vsubps_avx512vl(auVar75,auVar155);
    auVar79 = vsubps_avx512vl(auVar70,auVar69);
    auVar82 = vaddps_avx512vl(auVar82,auVar79);
    auVar79 = vsubps_avx512vl(auVar77,auVar71);
    auVar78 = vaddps_avx512vl(auVar78,auVar79);
    auVar79 = vmulps_avx512vl(auVar155,auVar82);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar148,auVar78);
    auVar80 = vmulps_avx512vl(auVar74,auVar82);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar124,auVar78);
    auVar81 = vmulps_avx512vl(auVar72,auVar82);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar84,auVar78);
    auVar83 = vmulps_avx512vl(auVar71,auVar82);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar69,auVar78);
    auVar87 = vmulps_avx512vl(auVar75,auVar82);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar73,auVar78);
    auVar88 = vmulps_avx512vl(auVar86,auVar82);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar211,auVar78);
    auVar89 = vmulps_avx512vl(auVar85,auVar82);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar76,auVar78);
    auVar82 = vmulps_avx512vl(auVar77,auVar82);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar70,auVar78);
    auVar78 = vminps_avx512vl(auVar79,auVar80);
    auVar79 = vmaxps_avx512vl(auVar79,auVar80);
    auVar80 = vminps_avx512vl(auVar81,auVar83);
    auVar78 = vminps_avx512vl(auVar78,auVar80);
    auVar80 = vmaxps_avx512vl(auVar81,auVar83);
    auVar79 = vmaxps_avx512vl(auVar79,auVar80);
    auVar80 = vminps_avx512vl(auVar87,auVar88);
    auVar81 = vmaxps_avx512vl(auVar87,auVar88);
    auVar83 = vminps_avx512vl(auVar89,auVar82);
    auVar80 = vminps_avx512vl(auVar80,auVar83);
    auVar78 = vminps_avx512vl(auVar78,auVar80);
    auVar82 = vmaxps_avx512vl(auVar89,auVar82);
    auVar82 = vmaxps_avx512vl(auVar81,auVar82);
    auVar82 = vmaxps_avx512vl(auVar79,auVar82);
    uVar19 = vcmpps_avx512vl(auVar78,local_1c0,2);
    uVar20 = vcmpps_avx512vl(auVar82,local_1e0,5);
    uVar106 = 0;
    bVar36 = (byte)uVar19 & (byte)uVar20 & 0x7f;
    if (bVar36 != 0) {
      auVar82 = vsubps_avx512vl(auVar69,auVar148);
      auVar78 = vsubps_avx512vl(auVar71,auVar155);
      auVar79 = vsubps_avx512vl(auVar70,auVar73);
      auVar82 = vaddps_avx512vl(auVar82,auVar79);
      auVar79 = vsubps_avx512vl(auVar77,auVar75);
      auVar78 = vaddps_avx512vl(auVar78,auVar79);
      auVar79 = vmulps_avx512vl(auVar155,auVar82);
      auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar78,auVar148);
      auVar74 = vmulps_avx512vl(auVar74,auVar82);
      auVar74 = vfnmadd213ps_avx512vl(auVar124,auVar78,auVar74);
      auVar72 = vmulps_avx512vl(auVar72,auVar82);
      auVar72 = vfnmadd213ps_avx512vl(auVar84,auVar78,auVar72);
      auVar84 = vmulps_avx512vl(auVar71,auVar82);
      auVar69 = vfnmadd231ps_avx512vl(auVar84,auVar78,auVar69);
      auVar84 = vmulps_avx512vl(auVar75,auVar82);
      auVar71 = vfnmadd231ps_avx512vl(auVar84,auVar78,auVar73);
      auVar84 = vmulps_avx512vl(auVar86,auVar82);
      auVar86 = vfnmadd213ps_avx512vl(auVar211,auVar78,auVar84);
      auVar84 = vmulps_avx512vl(auVar85,auVar82);
      auVar73 = vfnmadd213ps_avx512vl(auVar76,auVar78,auVar84);
      auVar82 = vmulps_avx512vl(auVar77,auVar82);
      auVar70 = vfnmadd231ps_avx512vl(auVar82,auVar70,auVar78);
      auVar76 = vminps_avx(auVar79,auVar74);
      auVar82 = vmaxps_avx(auVar79,auVar74);
      auVar84 = vminps_avx(auVar72,auVar69);
      auVar84 = vminps_avx(auVar76,auVar84);
      auVar76 = vmaxps_avx(auVar72,auVar69);
      auVar82 = vmaxps_avx(auVar82,auVar76);
      auVar69 = vminps_avx(auVar71,auVar86);
      auVar76 = vmaxps_avx(auVar71,auVar86);
      auVar85 = vminps_avx(auVar73,auVar70);
      auVar69 = vminps_avx(auVar69,auVar85);
      auVar69 = vminps_avx(auVar84,auVar69);
      auVar84 = vmaxps_avx(auVar73,auVar70);
      auVar76 = vmaxps_avx(auVar76,auVar84);
      auVar82 = vmaxps_avx(auVar82,auVar76);
      uVar19 = vcmpps_avx512vl(auVar82,local_1e0,5);
      uVar20 = vcmpps_avx512vl(auVar69,local_1c0,2);
      uVar106 = (uint)(bVar36 & (byte)uVar19 & (byte)uVar20);
    }
    if (uVar106 != 0) {
      auStack_410[uVar38] = uVar106;
      uVar19 = vmovlps_avx(auVar46);
      *(undefined8 *)(&uStack_260 + uVar38 * 2) = uVar19;
      uVar42 = vmovlps_avx(auVar59);
      auStack_1a0[uVar38] = uVar42;
      uVar38 = (ulong)((int)uVar38 + 1);
    }
    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar263 = ZEXT1664(auVar46);
    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    in_ZMM18 = ZEXT3264(auVar82);
    auVar264 = ZEXT464(0x3f800000);
    do {
      auVar46 = SUB6416(ZEXT464(0xb8d1b717),0);
      if ((int)uVar38 == 0) {
        uVar111 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar24._4_4_ = uVar111;
        auVar24._0_4_ = uVar111;
        auVar24._8_4_ = uVar111;
        auVar24._12_4_ = uVar111;
        uVar19 = vcmpps_avx512vl(local_3d0,auVar24,2);
        uVar43 = (uint)uVar44 & (uint)uVar19;
        uVar44 = (ulong)uVar43;
        if (uVar43 == 0) {
          return;
        }
        goto LAB_01b76b8c;
      }
      uVar37 = (int)uVar38 - 1;
      uVar39 = (ulong)uVar37;
      uVar106 = (&uStack_260)[uVar39 * 2];
      fVar227 = afStack_25c[uVar39 * 2];
      uVar5 = auStack_410[uVar39];
      auVar261._8_8_ = 0;
      auVar261._0_8_ = auStack_1a0[uVar39];
      auVar262 = ZEXT1664(auVar261);
      lVar41 = 0;
      for (uVar42 = (ulong)uVar5; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
        lVar41 = lVar41 + 1;
      }
      uVar40 = uVar5 - 1 & uVar5;
      auStack_410[uVar39] = uVar40;
      if (uVar40 == 0) {
        uVar38 = (ulong)uVar37;
      }
      auVar129._0_4_ = (float)lVar41;
      auVar129._4_8_ = SUB128(ZEXT812(0),4);
      auVar129._12_4_ = 0;
      auVar57 = vmulss_avx512f(auVar129,SUB6416(ZEXT464(0x3e124925),0));
      lVar41 = lVar41 + 1;
      auVar55 = vmulss_avx512f(ZEXT416((uint)(float)lVar41),SUB6416(ZEXT464(0x3e124925),0));
      auVar50 = auVar264._0_16_;
      auVar54 = vsubss_avx512f(auVar50,auVar57);
      auVar57 = vmulss_avx512f(ZEXT416((uint)fVar227),auVar57);
      auVar54 = vfmadd231ss_avx512f(auVar57,ZEXT416(uVar106),auVar54);
      auVar57 = vsubss_avx512f(auVar50,auVar55);
      auVar57 = vfmadd231ss_fma(ZEXT416((uint)(fVar227 * auVar55._0_4_)),ZEXT416(uVar106),auVar57);
      auVar55 = vsubss_avx512f(auVar57,auVar54);
      vucomiss_avx512f(auVar55);
      if (uVar5 == 0 || lVar41 == 0) break;
      auVar48 = vshufps_avx(auVar261,auVar261,0x50);
      vucomiss_avx512f(auVar55);
      uVar106 = (uint)uVar38;
      auVar247 = auVar266._0_16_;
      auVar59 = vsubps_avx512vl(auVar247,auVar48);
      fVar227 = auVar48._0_4_;
      auVar142._0_4_ = fVar125 * fVar227;
      fVar212 = auVar48._4_4_;
      auVar142._4_4_ = fVar133 * fVar212;
      fVar223 = auVar48._8_4_;
      auVar142._8_4_ = fVar125 * fVar223;
      fVar224 = auVar48._12_4_;
      auVar142._12_4_ = fVar133 * fVar224;
      auVar152._0_4_ = fVar150 * fVar227;
      auVar152._4_4_ = fVar158 * fVar212;
      auVar152._8_4_ = fVar150 * fVar223;
      auVar152._12_4_ = fVar158 * fVar224;
      auVar163._0_4_ = fVar243 * fVar227;
      auVar163._4_4_ = fVar244 * fVar212;
      auVar163._8_4_ = fVar243 * fVar223;
      auVar163._12_4_ = fVar244 * fVar224;
      auVar119._0_4_ = fVar134 * fVar227;
      auVar119._4_4_ = fVar135 * fVar212;
      auVar119._8_4_ = fVar134 * fVar223;
      auVar119._12_4_ = fVar135 * fVar224;
      auVar48 = vfmadd231ps_fma(auVar142,auVar59,local_420);
      auVar82._16_16_ = vfmadd231ps_fma(auVar152,auVar59,local_430);
      auVar53 = vfmadd231ps_fma(auVar163,auVar59,local_440);
      auVar60 = vfmadd231ps_avx512vl(auVar119,auVar117,auVar59);
      auVar79._16_16_ = auVar48;
      auVar79._0_16_ = auVar48;
      auVar81._16_16_ = auVar82._16_16_;
      auVar81._0_16_ = auVar82._16_16_;
      auVar156._16_16_ = auVar53;
      auVar156._0_16_ = auVar53;
      uVar111 = auVar54._0_4_;
      auVar180._4_4_ = uVar111;
      auVar180._0_4_ = uVar111;
      auVar180._8_4_ = uVar111;
      auVar180._12_4_ = uVar111;
      uVar111 = auVar57._0_4_;
      auVar180._20_4_ = uVar111;
      auVar180._16_4_ = uVar111;
      auVar180._24_4_ = uVar111;
      auVar180._28_4_ = uVar111;
      auVar82 = vsubps_avx(auVar81,auVar79);
      auVar82._16_16_ = vfmadd213ps_fma(auVar82,auVar180,auVar79);
      auVar76 = vsubps_avx(auVar156,auVar81);
      auVar59 = vfmadd213ps_fma(auVar76,auVar180,auVar81);
      auVar48 = vsubps_avx(auVar60,auVar53);
      auVar149._16_16_ = auVar48;
      auVar149._0_16_ = auVar48;
      auVar48 = vfmadd213ps_fma(auVar149,auVar180,auVar156);
      auVar76 = vsubps_avx(ZEXT1632(auVar59),ZEXT1632(auVar82._16_16_));
      auVar82._16_16_ = vfmadd213ps_fma(auVar76,auVar180,ZEXT1632(auVar82._16_16_));
      auVar76 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar59));
      auVar48 = vfmadd213ps_fma(auVar76,auVar180,ZEXT1632(auVar59));
      auVar76 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar82._16_16_));
      auVar67 = vfmadd231ps_fma(ZEXT1632(auVar82._16_16_),auVar76,auVar180);
      auVar82 = vmulps_avx512vl(auVar76,in_ZMM18._0_32_);
      auVar48 = vmulss_avx512f(auVar55,SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar227 = auVar48._0_4_;
      auVar164._0_8_ =
           CONCAT44(auVar67._4_4_ + fVar227 * auVar82._4_4_,auVar67._0_4_ + fVar227 * auVar82._0_4_)
      ;
      auVar164._8_4_ = auVar67._8_4_ + fVar227 * auVar82._8_4_;
      auVar164._12_4_ = auVar67._12_4_ + fVar227 * auVar82._12_4_;
      auVar143._0_4_ = fVar227 * auVar82._16_4_;
      auVar143._4_4_ = fVar227 * auVar82._20_4_;
      auVar143._8_4_ = fVar227 * auVar82._24_4_;
      auVar143._12_4_ = fVar227 * auVar82._28_4_;
      auVar159 = vsubps_avx((undefined1  [16])0x0,auVar143);
      auVar64 = vshufpd_avx(auVar67,auVar67,3);
      auVar66 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar48 = vsubps_avx(auVar64,auVar67);
      auVar53 = vsubps_avx(auVar66,(undefined1  [16])0x0);
      auVar183._0_4_ = auVar53._0_4_ + auVar48._0_4_;
      auVar183._4_4_ = auVar53._4_4_ + auVar48._4_4_;
      auVar183._8_4_ = auVar53._8_4_ + auVar48._8_4_;
      auVar183._12_4_ = auVar53._12_4_ + auVar48._12_4_;
      auVar48 = vshufps_avx(auVar67,auVar67,0xb1);
      auVar53 = vshufps_avx(auVar164,auVar164,0xb1);
      auVar59 = vshufps_avx(auVar159,auVar159,0xb1);
      auVar60 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar236._4_4_ = auVar183._0_4_;
      auVar236._0_4_ = auVar183._0_4_;
      auVar236._8_4_ = auVar183._0_4_;
      auVar236._12_4_ = auVar183._0_4_;
      auVar65 = vshufps_avx(auVar183,auVar183,0x55);
      fVar227 = auVar65._0_4_;
      auVar197._0_4_ = auVar48._0_4_ * fVar227;
      fVar212 = auVar65._4_4_;
      auVar197._4_4_ = auVar48._4_4_ * fVar212;
      fVar223 = auVar65._8_4_;
      auVar197._8_4_ = auVar48._8_4_ * fVar223;
      fVar224 = auVar65._12_4_;
      auVar197._12_4_ = auVar48._12_4_ * fVar224;
      auVar209._0_4_ = auVar53._0_4_ * fVar227;
      auVar209._4_4_ = auVar53._4_4_ * fVar212;
      auVar209._8_4_ = auVar53._8_4_ * fVar223;
      auVar209._12_4_ = auVar53._12_4_ * fVar224;
      auVar215._0_4_ = auVar59._0_4_ * fVar227;
      auVar215._4_4_ = auVar59._4_4_ * fVar212;
      auVar215._8_4_ = auVar59._8_4_ * fVar223;
      auVar215._12_4_ = auVar59._12_4_ * fVar224;
      auVar184._0_4_ = auVar60._0_4_ * fVar227;
      auVar184._4_4_ = auVar60._4_4_ * fVar212;
      auVar184._8_4_ = auVar60._8_4_ * fVar223;
      auVar184._12_4_ = auVar60._12_4_ * fVar224;
      auVar48 = vfmadd231ps_fma(auVar197,auVar236,auVar67);
      auVar53 = vfmadd231ps_fma(auVar209,auVar236,auVar164);
      auVar65 = vfmadd231ps_fma(auVar215,auVar236,auVar159);
      auVar169 = vfmadd231ps_fma(auVar184,(undefined1  [16])0x0,auVar236);
      auVar63 = vshufpd_avx(auVar48,auVar48,1);
      auVar61 = vshufpd_avx(auVar53,auVar53,1);
      auVar62 = vshufpd_avx(auVar65,auVar65,1);
      auVar68 = vshufpd_avx(auVar169,auVar169,1);
      auVar59 = vminss_avx(auVar48,auVar53);
      auVar48 = vmaxss_avx(auVar53,auVar48);
      auVar60 = vminss_avx(auVar65,auVar169);
      auVar53 = vmaxss_avx(auVar169,auVar65);
      auVar60 = vminss_avx(auVar59,auVar60);
      auVar48 = vmaxss_avx(auVar53,auVar48);
      auVar65 = vminss_avx(auVar63,auVar61);
      auVar53 = vmaxss_avx(auVar61,auVar63);
      auVar63 = vminss_avx(auVar62,auVar68);
      auVar59 = vmaxss_avx(auVar68,auVar62);
      auVar65 = vminss_avx(auVar65,auVar63);
      auVar53 = vmaxss_avx(auVar59,auVar53);
      vucomiss_avx512f(auVar60);
      if ((uVar106 < 5) || (auVar53 = vucomiss_avx512f(auVar46), uVar106 < 5)) {
        auVar48 = vucomiss_avx512f(auVar46);
        uVar19 = vcmpps_avx512vl(auVar65,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar20 = vcmpps_avx512vl(auVar60,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((4 < uVar106 & ((byte)uVar20 | (byte)uVar19)) != 0) goto LAB_01b77acc;
        uVar19 = vcmpps_avx512vl(auVar46,auVar53,5);
        uVar20 = vcmpps_avx512vl(auVar65,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar20 | (ushort)uVar19) & 1) == 0) goto LAB_01b77acc;
        bVar10 = true;
        auVar262 = ZEXT1664(auVar261);
      }
      else {
LAB_01b77acc:
        auVar63 = auVar268._0_16_;
        uVar19 = vcmpss_avx512f(auVar60,auVar63,1);
        bVar10 = (bool)((byte)uVar19 & 1);
        iVar107 = auVar264._0_4_;
        fVar227 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar107);
        uVar19 = vcmpss_avx512f(auVar48,auVar63,1);
        bVar10 = (bool)((byte)uVar19 & 1);
        fVar212 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar107);
        bVar10 = fVar227 != fVar212;
        iVar267 = auVar268._0_4_;
        auVar82._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar90._4_28_ = auVar82._4_28_;
        auVar90._0_4_ = (uint)bVar10 * iVar267 + (uint)!bVar10 * 0x7f800000;
        auVar59 = auVar90._0_16_;
        auVar92._16_16_ = auVar82._16_16_;
        auVar92._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar91._4_28_ = auVar92._4_28_;
        auVar91._0_4_ = (uint)bVar10 * iVar267 + (uint)!bVar10 * -0x800000;
        auVar46 = auVar91._0_16_;
        uVar19 = vcmpss_avx512f(auVar65,auVar63,1);
        bVar10 = (bool)((byte)uVar19 & 1);
        fVar223 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar107);
        if ((fVar227 != fVar223) || (NAN(fVar227) || NAN(fVar223))) {
          fVar224 = auVar65._0_4_;
          fVar227 = auVar60._0_4_;
          bVar10 = fVar224 == fVar227;
          if ((!bVar10) || (NAN(fVar224) || NAN(fVar227))) {
            auVar23._8_4_ = 0x80000000;
            auVar23._0_8_ = 0x8000000080000000;
            auVar23._12_4_ = 0x80000000;
            auVar60 = vxorps_avx512vl(auVar60,auVar23);
            auVar256._0_4_ = auVar60._0_4_ / (fVar224 - fVar227);
            auVar256._4_12_ = auVar60._4_12_;
            auVar60 = vsubss_avx512f(auVar50,auVar256);
            auVar65 = vfmadd213ss_avx512f(auVar60,auVar63,auVar256);
            auVar60 = auVar65;
          }
          else {
            vucomiss_avx512f(auVar63);
            auVar94._16_16_ = auVar82._16_16_;
            auVar94._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar93._4_28_ = auVar94._4_28_;
            auVar93._0_4_ = (uint)bVar10 * iVar267 + (uint)!bVar10 * 0x7f800000;
            auVar65 = auVar93._0_16_;
            auVar60 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar59 = vminss_avx(auVar59,auVar65);
          auVar46 = vmaxss_avx(auVar60,auVar46);
        }
        auVar262 = ZEXT1664(auVar261);
        uVar19 = vcmpss_avx512f(auVar53,auVar63,1);
        bVar10 = (bool)((byte)uVar19 & 1);
        fVar227 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar107);
        if ((fVar212 != fVar227) || (NAN(fVar212) || NAN(fVar227))) {
          fVar224 = auVar53._0_4_;
          fVar212 = auVar48._0_4_;
          bVar10 = fVar224 == fVar212;
          if ((!bVar10) || (NAN(fVar224) || NAN(fVar212))) {
            auVar22._8_4_ = 0x80000000;
            auVar22._0_8_ = 0x8000000080000000;
            auVar22._12_4_ = 0x80000000;
            auVar48 = vxorps_avx512vl(auVar48,auVar22);
            auVar216._0_4_ = auVar48._0_4_ / (fVar224 - fVar212);
            auVar216._4_12_ = auVar48._4_12_;
            auVar48 = vsubss_avx512f(auVar50,auVar216);
            auVar53 = vfmadd213ss_avx512f(auVar48,auVar63,auVar216);
            auVar48 = auVar53;
          }
          else {
            vucomiss_avx512f(auVar63);
            auVar96._16_16_ = auVar82._16_16_;
            auVar96._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar95._4_28_ = auVar96._4_28_;
            auVar95._0_4_ = (uint)bVar10 * iVar267 + (uint)!bVar10 * 0x7f800000;
            auVar53 = auVar95._0_16_;
            auVar48 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar59 = vminss_avx(auVar59,auVar53);
          auVar46 = vmaxss_avx(auVar48,auVar46);
        }
        bVar10 = fVar223 != fVar227;
        auVar48 = vminss_avx512f(auVar59,auVar50);
        auVar98._16_16_ = auVar82._16_16_;
        auVar98._0_16_ = auVar59;
        auVar97._4_28_ = auVar98._4_28_;
        auVar97._0_4_ = (uint)bVar10 * auVar48._0_4_ + (uint)!bVar10 * auVar59._0_4_;
        auVar48 = vmaxss_avx512f(auVar50,auVar46);
        auVar100._16_16_ = auVar82._16_16_;
        auVar100._0_16_ = auVar46;
        auVar99._4_28_ = auVar100._4_28_;
        auVar99._0_4_ = (uint)bVar10 * auVar48._0_4_ + (uint)!bVar10 * auVar46._0_4_;
        auVar46 = vmaxss_avx512f(auVar63,auVar97._0_16_);
        auVar48 = vminss_avx512f(auVar99._0_16_,auVar50);
        bVar10 = true;
        if (auVar46._0_4_ <= auVar48._0_4_) {
          auVar61 = vmaxss_avx512f(auVar63,ZEXT416((uint)(auVar46._0_4_ + -0.1)));
          auVar62 = vminss_avx512f(ZEXT416((uint)(auVar48._0_4_ + 0.1)),auVar50);
          auVar120._0_8_ = auVar67._0_8_;
          auVar120._8_8_ = auVar120._0_8_;
          auVar210._8_8_ = auVar164._0_8_;
          auVar210._0_8_ = auVar164._0_8_;
          auVar217._8_8_ = auVar159._0_8_;
          auVar217._0_8_ = auVar159._0_8_;
          auVar46 = vshufpd_avx(auVar164,auVar164,3);
          auVar48 = vshufpd_avx(auVar159,auVar159,3);
          auVar53 = vshufps_avx(auVar61,auVar62,0);
          auVar63 = vsubps_avx512vl(auVar247,auVar53);
          fVar227 = auVar53._0_4_;
          auVar251._0_4_ = fVar227 * auVar64._0_4_;
          fVar212 = auVar53._4_4_;
          auVar251._4_4_ = fVar212 * auVar64._4_4_;
          fVar223 = auVar53._8_4_;
          auVar251._8_4_ = fVar223 * auVar64._8_4_;
          fVar224 = auVar53._12_4_;
          auVar251._12_4_ = fVar224 * auVar64._12_4_;
          auVar165._0_4_ = fVar227 * auVar46._0_4_;
          auVar165._4_4_ = fVar212 * auVar46._4_4_;
          auVar165._8_4_ = fVar223 * auVar46._8_4_;
          auVar165._12_4_ = fVar224 * auVar46._12_4_;
          auVar177._0_4_ = fVar227 * auVar48._0_4_;
          auVar177._4_4_ = fVar212 * auVar48._4_4_;
          auVar177._8_4_ = fVar223 * auVar48._8_4_;
          auVar177._12_4_ = fVar224 * auVar48._12_4_;
          auVar144._0_4_ = fVar227 * auVar66._0_4_;
          auVar144._4_4_ = fVar212 * auVar66._4_4_;
          auVar144._8_4_ = fVar223 * auVar66._8_4_;
          auVar144._12_4_ = fVar224 * auVar66._12_4_;
          auVar59 = vfmadd231ps_fma(auVar251,auVar63,auVar120);
          auVar60 = vfmadd231ps_fma(auVar165,auVar63,auVar210);
          auVar65 = vfmadd231ps_fma(auVar177,auVar63,auVar217);
          auVar63 = vfmadd231ps_fma(auVar144,auVar63,ZEXT816(0));
          auVar48 = vsubss_avx512f(auVar50,auVar61);
          auVar46 = vmovshdup_avx(auVar261);
          auVar159 = vfmadd231ss_fma(ZEXT416((uint)(auVar46._0_4_ * auVar61._0_4_)),auVar261,auVar48
                                    );
          auVar48 = vsubss_avx512f(auVar50,auVar62);
          auVar169 = vfmadd231ss_fma(ZEXT416((uint)(auVar62._0_4_ * auVar46._0_4_)),auVar261,auVar48
                                    );
          auVar64 = vdivss_avx512f(auVar50,auVar55);
          auVar46 = vsubps_avx(auVar60,auVar59);
          auVar130._0_4_ = auVar46._0_4_ * 3.0;
          auVar130._4_4_ = auVar46._4_4_ * 3.0;
          auVar130._8_4_ = auVar46._8_4_ * 3.0;
          auVar130._12_4_ = auVar46._12_4_ * 3.0;
          auVar46 = vsubps_avx(auVar65,auVar60);
          auVar185._0_4_ = auVar46._0_4_ * 3.0;
          auVar185._4_4_ = auVar46._4_4_ * 3.0;
          auVar185._8_4_ = auVar46._8_4_ * 3.0;
          auVar185._12_4_ = auVar46._12_4_ * 3.0;
          auVar46 = vsubps_avx(auVar63,auVar65);
          auVar198._0_4_ = auVar46._0_4_ * 3.0;
          auVar198._4_4_ = auVar46._4_4_ * 3.0;
          auVar198._8_4_ = auVar46._8_4_ * 3.0;
          auVar198._12_4_ = auVar46._12_4_ * 3.0;
          auVar55 = vminps_avx(auVar185,auVar198);
          auVar46 = vmaxps_avx(auVar185,auVar198);
          auVar55 = vminps_avx(auVar130,auVar55);
          auVar46 = vmaxps_avx(auVar130,auVar46);
          auVar48 = vshufpd_avx(auVar55,auVar55,3);
          auVar53 = vshufpd_avx(auVar46,auVar46,3);
          auVar55 = vminps_avx(auVar55,auVar48);
          auVar46 = vmaxps_avx(auVar46,auVar53);
          fVar227 = auVar64._0_4_;
          auVar199._0_4_ = fVar227 * auVar55._0_4_;
          auVar199._4_4_ = fVar227 * auVar55._4_4_;
          auVar199._8_4_ = fVar227 * auVar55._8_4_;
          auVar199._12_4_ = fVar227 * auVar55._12_4_;
          auVar186._0_4_ = fVar227 * auVar46._0_4_;
          auVar186._4_4_ = fVar227 * auVar46._4_4_;
          auVar186._8_4_ = fVar227 * auVar46._8_4_;
          auVar186._12_4_ = fVar227 * auVar46._12_4_;
          auVar64 = vdivss_avx512f(auVar50,ZEXT416((uint)(auVar169._0_4_ - auVar159._0_4_)));
          auVar46 = vshufpd_avx(auVar59,auVar59,3);
          auVar55 = vshufpd_avx(auVar60,auVar60,3);
          auVar48 = vshufpd_avx(auVar65,auVar65,3);
          auVar53 = vshufpd_avx(auVar63,auVar63,3);
          auVar46 = vsubps_avx(auVar46,auVar59);
          auVar59 = vsubps_avx(auVar55,auVar60);
          auVar60 = vsubps_avx(auVar48,auVar65);
          auVar53 = vsubps_avx(auVar53,auVar63);
          auVar55 = vminps_avx(auVar46,auVar59);
          auVar46 = vmaxps_avx(auVar46,auVar59);
          auVar48 = vminps_avx(auVar60,auVar53);
          auVar48 = vminps_avx(auVar55,auVar48);
          auVar55 = vmaxps_avx(auVar60,auVar53);
          auVar46 = vmaxps_avx(auVar46,auVar55);
          fVar227 = auVar64._0_4_;
          auVar218._0_4_ = fVar227 * auVar48._0_4_;
          auVar218._4_4_ = fVar227 * auVar48._4_4_;
          auVar218._8_4_ = fVar227 * auVar48._8_4_;
          auVar218._12_4_ = fVar227 * auVar48._12_4_;
          auVar229._0_4_ = fVar227 * auVar46._0_4_;
          auVar229._4_4_ = fVar227 * auVar46._4_4_;
          auVar229._8_4_ = fVar227 * auVar46._8_4_;
          auVar229._12_4_ = fVar227 * auVar46._12_4_;
          auVar68 = vinsertps_avx512f(auVar54,auVar159,0x10);
          auVar59 = vinsertps_avx(auVar57,auVar169,0x10);
          auVar110._0_4_ = auVar68._0_4_ + auVar59._0_4_;
          auVar110._4_4_ = auVar68._4_4_ + auVar59._4_4_;
          auVar110._8_4_ = auVar68._8_4_ + auVar59._8_4_;
          auVar110._12_4_ = auVar68._12_4_ + auVar59._12_4_;
          auVar61 = vmulps_avx512vl(auVar110,auVar263._0_16_);
          auVar48 = vshufps_avx(auVar61,auVar61,0x54);
          uVar111 = auVar61._0_4_;
          auVar131._4_4_ = uVar111;
          auVar131._0_4_ = uVar111;
          auVar131._8_4_ = uVar111;
          auVar131._12_4_ = uVar111;
          auVar60 = vfmadd213ps_avx512vl(auVar45,auVar131,auVar47);
          auVar55 = vfmadd213ps_fma(local_270,auVar131,auVar58);
          auVar53 = vfmadd213ps_fma(local_280,auVar131,auVar56);
          auVar46 = vsubps_avx(auVar55,auVar60);
          auVar60 = vfmadd213ps_fma(auVar46,auVar131,auVar60);
          auVar46 = vsubps_avx(auVar53,auVar55);
          auVar46 = vfmadd213ps_fma(auVar46,auVar131,auVar55);
          auVar46 = vsubps_avx(auVar46,auVar60);
          auVar55 = vfmadd231ps_fma(auVar60,auVar46,auVar131);
          auVar132._0_8_ = CONCAT44(auVar46._4_4_ * 3.0,auVar46._0_4_ * 3.0);
          auVar132._8_4_ = auVar46._8_4_ * 3.0;
          auVar132._12_4_ = auVar46._12_4_ * 3.0;
          auVar237._8_8_ = auVar55._0_8_;
          auVar237._0_8_ = auVar55._0_8_;
          auVar46 = vshufpd_avx(auVar55,auVar55,3);
          auVar55 = vshufps_avx(auVar61,auVar61,0x55);
          auVar53 = vsubps_avx(auVar46,auVar237);
          auVar60 = vfmadd231ps_fma(auVar237,auVar55,auVar53);
          auVar257._8_8_ = auVar132._0_8_;
          auVar257._0_8_ = auVar132._0_8_;
          auVar46 = vshufpd_avx(auVar132,auVar132,3);
          auVar46 = vsubps_avx(auVar46,auVar257);
          auVar55 = vfmadd213ps_fma(auVar46,auVar55,auVar257);
          auVar65 = vxorps_avx512vl(auVar53,auVar269._0_16_);
          auVar46 = vmovshdup_avx(auVar55);
          auVar63 = vxorps_avx512vl(auVar46,auVar269._0_16_);
          auVar64 = vmovshdup_avx512vl(auVar53);
          auVar63 = vpermt2ps_avx512vl(auVar63,ZEXT416(5),auVar53);
          auVar46 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar46._0_4_ * auVar53._0_4_)),auVar55,
                                        auVar64);
          auVar55 = vpermt2ps_avx512vl(auVar55,SUB6416(ZEXT464(4),0),auVar65);
          auVar145._0_4_ = auVar46._0_4_;
          auVar145._4_4_ = auVar145._0_4_;
          auVar145._8_4_ = auVar145._0_4_;
          auVar145._12_4_ = auVar145._0_4_;
          auVar46 = vdivps_avx(auVar63,auVar145);
          auVar55 = vdivps_avx(auVar55,auVar145);
          fVar212 = auVar60._0_4_;
          auVar53 = vshufps_avx(auVar60,auVar60,0x55);
          fVar227 = auVar55._0_4_;
          auVar238._0_4_ = fVar212 * auVar46._0_4_ + auVar53._0_4_ * fVar227;
          auVar238._4_4_ = fVar212 * auVar46._4_4_ + auVar53._4_4_ * auVar55._4_4_;
          auVar238._8_4_ = fVar212 * auVar46._8_4_ + auVar53._8_4_ * auVar55._8_4_;
          auVar238._12_4_ = fVar212 * auVar46._12_4_ + auVar53._12_4_ * auVar55._12_4_;
          auVar62 = vsubps_avx(auVar48,auVar238);
          auVar60 = vmovshdup_avx(auVar46);
          auVar48 = vinsertps_avx(auVar199,auVar218,0x1c);
          auVar258._0_4_ = auVar60._0_4_ * auVar48._0_4_;
          auVar258._4_4_ = auVar60._4_4_ * auVar48._4_4_;
          auVar258._8_4_ = auVar60._8_4_ * auVar48._8_4_;
          auVar258._12_4_ = auVar60._12_4_ * auVar48._12_4_;
          auVar53 = vinsertps_avx(auVar186,auVar229,0x1c);
          auVar239._0_4_ = auVar60._0_4_ * auVar53._0_4_;
          auVar239._4_4_ = auVar60._4_4_ * auVar53._4_4_;
          auVar239._8_4_ = auVar60._8_4_ * auVar53._8_4_;
          auVar239._12_4_ = auVar60._12_4_ * auVar53._12_4_;
          auVar66 = vminps_avx512vl(auVar258,auVar239);
          auVar63 = vmaxps_avx(auVar239,auVar258);
          auVar64 = vmovshdup_avx(auVar55);
          auVar60 = vinsertps_avx(auVar218,auVar199,0x4c);
          auVar219._0_4_ = auVar64._0_4_ * auVar60._0_4_;
          auVar219._4_4_ = auVar64._4_4_ * auVar60._4_4_;
          auVar219._8_4_ = auVar64._8_4_ * auVar60._8_4_;
          auVar219._12_4_ = auVar64._12_4_ * auVar60._12_4_;
          auVar65 = vinsertps_avx(auVar229,auVar186,0x4c);
          auVar230._0_4_ = auVar64._0_4_ * auVar65._0_4_;
          auVar230._4_4_ = auVar64._4_4_ * auVar65._4_4_;
          auVar230._8_4_ = auVar64._8_4_ * auVar65._8_4_;
          auVar230._12_4_ = auVar64._12_4_ * auVar65._12_4_;
          auVar64 = vminps_avx(auVar219,auVar230);
          auVar66 = vaddps_avx512vl(auVar66,auVar64);
          auVar64 = vmaxps_avx(auVar230,auVar219);
          auVar220._0_4_ = auVar63._0_4_ + auVar64._0_4_;
          auVar220._4_4_ = auVar63._4_4_ + auVar64._4_4_;
          auVar220._8_4_ = auVar63._8_4_ + auVar64._8_4_;
          auVar220._12_4_ = auVar63._12_4_ + auVar64._12_4_;
          auVar231._8_8_ = 0x3f80000000000000;
          auVar231._0_8_ = 0x3f80000000000000;
          auVar63 = vsubps_avx(auVar231,auVar220);
          auVar64 = vsubps_avx(auVar231,auVar66);
          auVar66 = vsubps_avx(auVar68,auVar61);
          auVar61 = vsubps_avx(auVar59,auVar61);
          fVar226 = auVar66._0_4_;
          auVar259._0_4_ = fVar226 * auVar63._0_4_;
          fVar234 = auVar66._4_4_;
          auVar259._4_4_ = fVar234 * auVar63._4_4_;
          fVar245 = auVar66._8_4_;
          auVar259._8_4_ = fVar245 * auVar63._8_4_;
          fVar246 = auVar66._12_4_;
          auVar259._12_4_ = fVar246 * auVar63._12_4_;
          auVar67 = vbroadcastss_avx512vl(auVar46);
          auVar48 = vmulps_avx512vl(auVar67,auVar48);
          auVar53 = vmulps_avx512vl(auVar67,auVar53);
          auVar67 = vminps_avx512vl(auVar48,auVar53);
          auVar48 = vmaxps_avx(auVar53,auVar48);
          auVar200._0_4_ = fVar227 * auVar60._0_4_;
          auVar200._4_4_ = fVar227 * auVar60._4_4_;
          auVar200._8_4_ = fVar227 * auVar60._8_4_;
          auVar200._12_4_ = fVar227 * auVar60._12_4_;
          auVar187._0_4_ = fVar227 * auVar65._0_4_;
          auVar187._4_4_ = fVar227 * auVar65._4_4_;
          auVar187._8_4_ = fVar227 * auVar65._8_4_;
          auVar187._12_4_ = fVar227 * auVar65._12_4_;
          auVar53 = vminps_avx(auVar200,auVar187);
          auVar60 = vaddps_avx512vl(auVar67,auVar53);
          auVar65 = vmulps_avx512vl(auVar66,auVar64);
          fVar212 = auVar61._0_4_;
          auVar221._0_4_ = fVar212 * auVar63._0_4_;
          fVar223 = auVar61._4_4_;
          auVar221._4_4_ = fVar223 * auVar63._4_4_;
          fVar224 = auVar61._8_4_;
          auVar221._8_4_ = fVar224 * auVar63._8_4_;
          fVar225 = auVar61._12_4_;
          auVar221._12_4_ = fVar225 * auVar63._12_4_;
          auVar232._0_4_ = fVar212 * auVar64._0_4_;
          auVar232._4_4_ = fVar223 * auVar64._4_4_;
          auVar232._8_4_ = fVar224 * auVar64._8_4_;
          auVar232._12_4_ = fVar225 * auVar64._12_4_;
          auVar53 = vmaxps_avx(auVar187,auVar200);
          auVar188._0_4_ = auVar48._0_4_ + auVar53._0_4_;
          auVar188._4_4_ = auVar48._4_4_ + auVar53._4_4_;
          auVar188._8_4_ = auVar48._8_4_ + auVar53._8_4_;
          auVar188._12_4_ = auVar48._12_4_ + auVar53._12_4_;
          auVar201._8_8_ = 0x3f800000;
          auVar201._0_8_ = 0x3f800000;
          auVar48 = vsubps_avx(auVar201,auVar188);
          auVar53 = vsubps_avx(auVar201,auVar60);
          auVar252._0_4_ = fVar226 * auVar48._0_4_;
          auVar252._4_4_ = fVar234 * auVar48._4_4_;
          auVar252._8_4_ = fVar245 * auVar48._8_4_;
          auVar252._12_4_ = fVar246 * auVar48._12_4_;
          auVar240._0_4_ = fVar226 * auVar53._0_4_;
          auVar240._4_4_ = fVar234 * auVar53._4_4_;
          auVar240._8_4_ = fVar245 * auVar53._8_4_;
          auVar240._12_4_ = fVar246 * auVar53._12_4_;
          auVar189._0_4_ = fVar212 * auVar48._0_4_;
          auVar189._4_4_ = fVar223 * auVar48._4_4_;
          auVar189._8_4_ = fVar224 * auVar48._8_4_;
          auVar189._12_4_ = fVar225 * auVar48._12_4_;
          auVar202._0_4_ = fVar212 * auVar53._0_4_;
          auVar202._4_4_ = fVar223 * auVar53._4_4_;
          auVar202._8_4_ = fVar224 * auVar53._8_4_;
          auVar202._12_4_ = fVar225 * auVar53._12_4_;
          auVar48 = vminps_avx(auVar252,auVar240);
          auVar53 = vminps_avx(auVar189,auVar202);
          auVar60 = vminps_avx(auVar48,auVar53);
          auVar48 = vmaxps_avx(auVar240,auVar252);
          auVar53 = vmaxps_avx(auVar202,auVar189);
          auVar53 = vmaxps_avx(auVar53,auVar48);
          auVar63 = vminps_avx512vl(auVar259,auVar65);
          auVar48 = vminps_avx(auVar221,auVar232);
          auVar48 = vminps_avx(auVar63,auVar48);
          auVar48 = vhaddps_avx(auVar60,auVar48);
          auVar65 = vmaxps_avx512vl(auVar65,auVar259);
          auVar60 = vmaxps_avx(auVar232,auVar221);
          auVar60 = vmaxps_avx(auVar60,auVar65);
          auVar53 = vhaddps_avx(auVar53,auVar60);
          auVar48 = vshufps_avx(auVar48,auVar48,0xe8);
          auVar53 = vshufps_avx(auVar53,auVar53,0xe8);
          auVar190._0_4_ = auVar48._0_4_ + auVar62._0_4_;
          auVar190._4_4_ = auVar48._4_4_ + auVar62._4_4_;
          auVar190._8_4_ = auVar48._8_4_ + auVar62._8_4_;
          auVar190._12_4_ = auVar48._12_4_ + auVar62._12_4_;
          auVar203._0_4_ = auVar53._0_4_ + auVar62._0_4_;
          auVar203._4_4_ = auVar53._4_4_ + auVar62._4_4_;
          auVar203._8_4_ = auVar53._8_4_ + auVar62._8_4_;
          auVar203._12_4_ = auVar53._12_4_ + auVar62._12_4_;
          auVar48 = vmaxps_avx(auVar68,auVar190);
          auVar53 = vminps_avx(auVar203,auVar59);
          uVar42 = vcmpps_avx512vl(auVar53,auVar48,1);
          auVar48 = vinsertps_avx(auVar159,auVar169,0x10);
          auVar262 = ZEXT1664(auVar48);
          auVar53 = ZEXT416(5);
          if ((uVar42 & 3) == 0) {
            vucomiss_avx512f(auVar54);
            auVar53 = vxorps_avx512vl(auVar53,auVar53);
            auVar268 = ZEXT1664(auVar53);
            if (uVar106 < 4 && (uVar5 == 0 || lVar41 == 0)) {
              bVar10 = false;
            }
            else {
              lVar41 = 200;
              do {
                auVar59 = vsubss_avx512f(auVar50,auVar62);
                fVar224 = auVar59._0_4_;
                fVar212 = fVar224 * fVar224 * fVar224;
                fVar225 = auVar62._0_4_;
                fVar223 = fVar225 * 3.0 * fVar224 * fVar224;
                fVar224 = fVar224 * fVar225 * fVar225 * 3.0;
                auVar166._4_4_ = fVar212;
                auVar166._0_4_ = fVar212;
                auVar166._8_4_ = fVar212;
                auVar166._12_4_ = fVar212;
                auVar153._4_4_ = fVar223;
                auVar153._0_4_ = fVar223;
                auVar153._8_4_ = fVar223;
                auVar153._12_4_ = fVar223;
                auVar121._4_4_ = fVar224;
                auVar121._0_4_ = fVar224;
                auVar121._8_4_ = fVar224;
                auVar121._12_4_ = fVar224;
                fVar225 = fVar225 * fVar225 * fVar225;
                auVar178._0_4_ = (float)local_450._0_4_ * fVar225;
                auVar178._4_4_ = (float)local_450._4_4_ * fVar225;
                auVar178._8_4_ = fStack_448 * fVar225;
                auVar178._12_4_ = fStack_444 * fVar225;
                auVar59 = vfmadd231ps_fma(auVar178,auVar56,auVar121);
                auVar59 = vfmadd231ps_fma(auVar59,auVar58,auVar153);
                auVar59 = vfmadd231ps_fma(auVar59,auVar47,auVar166);
                auVar122._8_8_ = auVar59._0_8_;
                auVar122._0_8_ = auVar59._0_8_;
                auVar59 = vshufpd_avx(auVar59,auVar59,3);
                auVar60 = vshufps_avx(auVar62,auVar62,0x55);
                auVar59 = vsubps_avx(auVar59,auVar122);
                auVar60 = vfmadd213ps_fma(auVar59,auVar60,auVar122);
                fVar212 = auVar60._0_4_;
                auVar59 = vshufps_avx(auVar60,auVar60,0x55);
                auVar123._0_4_ = auVar46._0_4_ * fVar212 + fVar227 * auVar59._0_4_;
                auVar123._4_4_ = auVar46._4_4_ * fVar212 + auVar55._4_4_ * auVar59._4_4_;
                auVar123._8_4_ = auVar46._8_4_ * fVar212 + auVar55._8_4_ * auVar59._8_4_;
                auVar123._12_4_ = auVar46._12_4_ * fVar212 + auVar55._12_4_ * auVar59._12_4_;
                auVar62 = vsubps_avx(auVar62,auVar123);
                auVar59 = vandps_avx512vl(auVar60,auVar265._0_16_);
                auVar60 = vprolq_avx512vl(auVar59,0x20);
                auVar59 = vmaxss_avx(auVar60,auVar59);
                bVar17 = auVar59._0_4_ <= (float)local_460._0_4_;
                if (auVar59._0_4_ < (float)local_460._0_4_) {
                  auVar46 = vucomiss_avx512f(auVar53);
                  if (bVar17) {
                    auVar55 = vucomiss_avx512f(auVar46);
                    auVar264 = ZEXT1664(auVar55);
                    if (bVar17) {
                      vmovshdup_avx(auVar46);
                      auVar55 = vucomiss_avx512f(auVar53);
                      if (bVar17) {
                        auVar50 = vucomiss_avx512f(auVar55);
                        auVar264 = ZEXT1664(auVar50);
                        if (bVar17) {
                          auVar59 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar62 = vinsertps_avx(auVar59,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar59 = vdpps_avx(auVar62,local_290,0x7f);
                          auVar60 = vdpps_avx(auVar62,local_2a0,0x7f);
                          auVar65 = vdpps_avx(auVar62,local_2b0,0x7f);
                          auVar63 = vdpps_avx(auVar62,local_2c0,0x7f);
                          auVar64 = vdpps_avx(auVar62,local_2d0,0x7f);
                          auVar66 = vdpps_avx(auVar62,local_2e0,0x7f);
                          auVar61 = vdpps_avx(auVar62,local_2f0,0x7f);
                          auVar62 = vdpps_avx(auVar62,local_300,0x7f);
                          auVar68 = vsubss_avx512f(auVar50,auVar55);
                          fVar224 = auVar55._0_4_;
                          auVar55 = vfmadd231ss_fma(ZEXT416((uint)(fVar224 * auVar64._0_4_)),auVar68
                                                    ,auVar59);
                          auVar59 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * fVar224)),auVar68
                                                    ,auVar60);
                          auVar60 = vfmadd231ss_fma(ZEXT416((uint)(auVar61._0_4_ * fVar224)),auVar68
                                                    ,auVar65);
                          auVar65 = vfmadd231ss_fma(ZEXT416((uint)(fVar224 * auVar62._0_4_)),auVar68
                                                    ,auVar63);
                          auVar50 = vsubss_avx512f(auVar50,auVar46);
                          auVar191._0_4_ = auVar50._0_4_;
                          fVar227 = auVar191._0_4_ * auVar191._0_4_ * auVar191._0_4_;
                          local_120 = auVar46._0_4_;
                          fVar212 = local_120 * 3.0 * auVar191._0_4_ * auVar191._0_4_;
                          fVar223 = auVar191._0_4_ * local_120 * local_120 * 3.0;
                          fVar226 = local_120 * local_120 * local_120;
                          auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar226 * auVar65._0_4_)),
                                                    ZEXT416((uint)fVar223),auVar60);
                          auVar50 = vfmadd231ss_fma(auVar50,ZEXT416((uint)fVar212),auVar59);
                          auVar55 = vfmadd231ss_fma(auVar50,ZEXT416((uint)fVar227),auVar55);
                          fVar225 = auVar55._0_4_;
                          if ((fVar108 <= fVar225) &&
                             (fVar234 = *(float *)(ray + k * 4 + 0x100), fVar225 <= fVar234)) {
                            auVar55 = vshufps_avx(auVar46,auVar46,0x55);
                            auVar60 = vsubps_avx512vl(auVar247,auVar55);
                            fVar245 = auVar55._0_4_;
                            auVar222._0_4_ = fVar245 * (float)local_320._0_4_;
                            fVar246 = auVar55._4_4_;
                            auVar222._4_4_ = fVar246 * (float)local_320._4_4_;
                            fVar253 = auVar55._8_4_;
                            auVar222._8_4_ = fVar253 * fStack_318;
                            fVar254 = auVar55._12_4_;
                            auVar222._12_4_ = fVar254 * fStack_314;
                            auVar233._0_4_ = fVar245 * (float)local_370._0_4_;
                            auVar233._4_4_ = fVar246 * (float)local_370._4_4_;
                            auVar233._8_4_ = fVar253 * fStack_368;
                            auVar233._12_4_ = fVar254 * fStack_364;
                            auVar241._0_4_ = fVar245 * (float)local_380._0_4_;
                            auVar241._4_4_ = fVar246 * (float)local_380._4_4_;
                            auVar241._8_4_ = fVar253 * fStack_378;
                            auVar241._12_4_ = fVar254 * fStack_374;
                            auVar204._0_4_ = fVar245 * (float)local_340._0_4_;
                            auVar204._4_4_ = fVar246 * (float)local_340._4_4_;
                            auVar204._8_4_ = fVar253 * fStack_338;
                            auVar204._12_4_ = fVar254 * fStack_334;
                            auVar55 = vfmadd231ps_fma(auVar222,auVar60,local_310);
                            auVar50 = vfmadd231ps_fma(auVar233,auVar60,local_350);
                            auVar59 = vfmadd231ps_fma(auVar241,auVar60,local_360);
                            auVar60 = vfmadd231ps_fma(auVar204,auVar60,local_330);
                            auVar55 = vsubps_avx(auVar50,auVar55);
                            auVar50 = vsubps_avx(auVar59,auVar50);
                            auVar59 = vsubps_avx(auVar60,auVar59);
                            auVar242._0_4_ = local_120 * auVar50._0_4_;
                            auVar242._4_4_ = local_120 * auVar50._4_4_;
                            auVar242._8_4_ = local_120 * auVar50._8_4_;
                            auVar242._12_4_ = local_120 * auVar50._12_4_;
                            auVar191._4_4_ = auVar191._0_4_;
                            auVar191._8_4_ = auVar191._0_4_;
                            auVar191._12_4_ = auVar191._0_4_;
                            auVar55 = vfmadd231ps_fma(auVar242,auVar191,auVar55);
                            auVar205._0_4_ = local_120 * auVar59._0_4_;
                            auVar205._4_4_ = local_120 * auVar59._4_4_;
                            auVar205._8_4_ = local_120 * auVar59._8_4_;
                            auVar205._12_4_ = local_120 * auVar59._12_4_;
                            auVar50 = vfmadd231ps_fma(auVar205,auVar191,auVar50);
                            auVar206._0_4_ = local_120 * auVar50._0_4_;
                            auVar206._4_4_ = local_120 * auVar50._4_4_;
                            auVar206._8_4_ = local_120 * auVar50._8_4_;
                            auVar206._12_4_ = local_120 * auVar50._12_4_;
                            auVar55 = vfmadd231ps_fma(auVar206,auVar191,auVar55);
                            auVar21._8_4_ = 0x40400000;
                            auVar21._0_8_ = 0x4040000040400000;
                            auVar21._12_4_ = 0x40400000;
                            auVar55 = vmulps_avx512vl(auVar55,auVar21);
                            pGVar6 = (context->scene->geometries).items[uVar43].ptr;
                            if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                              auVar179._0_4_ = fVar226 * (float)local_3c0._0_4_;
                              auVar179._4_4_ = fVar226 * (float)local_3c0._4_4_;
                              auVar179._8_4_ = fVar226 * fStack_3b8;
                              auVar179._12_4_ = fVar226 * fStack_3b4;
                              auVar167._4_4_ = fVar223;
                              auVar167._0_4_ = fVar223;
                              auVar167._8_4_ = fVar223;
                              auVar167._12_4_ = fVar223;
                              auVar50 = vfmadd132ps_fma(auVar167,auVar179,local_3b0);
                              auVar154._4_4_ = fVar212;
                              auVar154._0_4_ = fVar212;
                              auVar154._8_4_ = fVar212;
                              auVar154._12_4_ = fVar212;
                              auVar50 = vfmadd132ps_fma(auVar154,auVar50,local_3a0);
                              auVar146._4_4_ = fVar227;
                              auVar146._0_4_ = fVar227;
                              auVar146._8_4_ = fVar227;
                              auVar146._12_4_ = fVar227;
                              auVar60 = vfmadd132ps_fma(auVar146,auVar50,local_390);
                              auVar50 = vshufps_avx(auVar60,auVar60,0xc9);
                              auVar59 = vshufps_avx(auVar55,auVar55,0xc9);
                              auVar147._0_4_ = auVar60._0_4_ * auVar59._0_4_;
                              auVar147._4_4_ = auVar60._4_4_ * auVar59._4_4_;
                              auVar147._8_4_ = auVar60._8_4_ * auVar59._8_4_;
                              auVar147._12_4_ = auVar60._12_4_ * auVar59._12_4_;
                              auVar55 = vfmsub231ps_fma(auVar147,auVar55,auVar50);
                              local_140 = auVar55._0_4_;
                              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                 (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                                *(float *)(ray + k * 4 + 0x100) = fVar225;
                                uVar111 = vextractps_avx(auVar55,1);
                                *(undefined4 *)(ray + k * 4 + 0x180) = uVar111;
                                uVar111 = vextractps_avx(auVar55,2);
                                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar111;
                                *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                                *(float *)(ray + k * 4 + 0x1e0) = local_120;
                                *(float *)(ray + k * 4 + 0x200) = fVar224;
                                *(uint *)(ray + k * 4 + 0x220) = uVar4;
                                *(uint *)(ray + k * 4 + 0x240) = uVar43;
                                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                              }
                              else {
                                auVar157._8_4_ = 1;
                                auVar157._0_8_ = 0x100000001;
                                auVar157._12_4_ = 1;
                                auVar157._16_4_ = 1;
                                auVar157._20_4_ = 1;
                                auVar157._24_4_ = 1;
                                auVar157._28_4_ = 1;
                                local_100 = vpermps_avx2(auVar157,ZEXT1632(auVar46));
                                auVar76 = vpermps_avx2(auVar157,ZEXT1632(auVar55));
                                auVar168._8_4_ = 2;
                                auVar168._0_8_ = 0x200000002;
                                auVar168._12_4_ = 2;
                                auVar168._16_4_ = 2;
                                auVar168._20_4_ = 2;
                                auVar168._24_4_ = 2;
                                auVar168._28_4_ = 2;
                                local_160 = vpermps_avx2(auVar168,ZEXT1632(auVar55));
                                local_180[0] = (RTCHitN)auVar76[0];
                                local_180[1] = (RTCHitN)auVar76[1];
                                local_180[2] = (RTCHitN)auVar76[2];
                                local_180[3] = (RTCHitN)auVar76[3];
                                local_180[4] = (RTCHitN)auVar76[4];
                                local_180[5] = (RTCHitN)auVar76[5];
                                local_180[6] = (RTCHitN)auVar76[6];
                                local_180[7] = (RTCHitN)auVar76[7];
                                local_180[8] = (RTCHitN)auVar76[8];
                                local_180[9] = (RTCHitN)auVar76[9];
                                local_180[10] = (RTCHitN)auVar76[10];
                                local_180[0xb] = (RTCHitN)auVar76[0xb];
                                local_180[0xc] = (RTCHitN)auVar76[0xc];
                                local_180[0xd] = (RTCHitN)auVar76[0xd];
                                local_180[0xe] = (RTCHitN)auVar76[0xe];
                                local_180[0xf] = (RTCHitN)auVar76[0xf];
                                local_180[0x10] = (RTCHitN)auVar76[0x10];
                                local_180[0x11] = (RTCHitN)auVar76[0x11];
                                local_180[0x12] = (RTCHitN)auVar76[0x12];
                                local_180[0x13] = (RTCHitN)auVar76[0x13];
                                local_180[0x14] = (RTCHitN)auVar76[0x14];
                                local_180[0x15] = (RTCHitN)auVar76[0x15];
                                local_180[0x16] = (RTCHitN)auVar76[0x16];
                                local_180[0x17] = (RTCHitN)auVar76[0x17];
                                local_180[0x18] = (RTCHitN)auVar76[0x18];
                                local_180[0x19] = (RTCHitN)auVar76[0x19];
                                local_180[0x1a] = (RTCHitN)auVar76[0x1a];
                                local_180[0x1b] = (RTCHitN)auVar76[0x1b];
                                local_180[0x1c] = (RTCHitN)auVar76[0x1c];
                                local_180[0x1d] = (RTCHitN)auVar76[0x1d];
                                local_180[0x1e] = (RTCHitN)auVar76[0x1e];
                                local_180[0x1f] = (RTCHitN)auVar76[0x1f];
                                uStack_13c = local_140;
                                uStack_138 = local_140;
                                uStack_134 = local_140;
                                uStack_130 = local_140;
                                uStack_12c = local_140;
                                uStack_128 = local_140;
                                uStack_124 = local_140;
                                fStack_11c = local_120;
                                fStack_118 = local_120;
                                fStack_114 = local_120;
                                fStack_110 = local_120;
                                fStack_10c = local_120;
                                fStack_108 = local_120;
                                fStack_104 = local_120;
                                local_e0 = local_220._0_8_;
                                uStack_d8 = local_220._8_8_;
                                uStack_d0 = local_220._16_8_;
                                uStack_c8 = local_220._24_8_;
                                local_c0 = local_200;
                                vpcmpeqd_avx2(local_200,local_200);
                                uStack_9c = context->user->instID[0];
                                local_a0 = uStack_9c;
                                uStack_98 = uStack_9c;
                                uStack_94 = uStack_9c;
                                uStack_90 = uStack_9c;
                                uStack_8c = uStack_9c;
                                uStack_88 = uStack_9c;
                                uStack_84 = uStack_9c;
                                uStack_7c = context->user->instPrimID[0];
                                local_80 = uStack_7c;
                                uStack_78 = uStack_7c;
                                uStack_74 = uStack_7c;
                                uStack_70 = uStack_7c;
                                uStack_6c = uStack_7c;
                                uStack_68 = uStack_7c;
                                uStack_64 = uStack_7c;
                                *(float *)(ray + k * 4 + 0x100) = fVar225;
                                local_400 = local_240._0_8_;
                                uStack_3f8 = local_240._8_8_;
                                uStack_3f0 = local_240._16_8_;
                                uStack_3e8 = local_240._24_8_;
                                local_490.valid = (int *)&local_400;
                                local_490.geometryUserPtr = pGVar6->userPtr;
                                local_490.context = context->user;
                                local_490.hit = local_180;
                                local_490.N = 8;
                                local_490.ray = (RTCRayN *)ray;
                                if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                  (*pGVar6->intersectionFilterN)(&local_490);
                                  auVar46 = vxorps_avx512vl(auVar53,auVar53);
                                  auVar268 = ZEXT1664(auVar46);
                                  auVar264 = ZEXT464(0x3f800000);
                                  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  in_ZMM18 = ZEXT3264(auVar82);
                                  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                  auVar263 = ZEXT1664(auVar46);
                                  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar269 = ZEXT1664(auVar46);
                                  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar265 = ZEXT1664(auVar46);
                                }
                                auVar46 = auVar268._0_16_;
                                auVar34._8_8_ = uStack_3f8;
                                auVar34._0_8_ = local_400;
                                auVar34._16_8_ = uStack_3f0;
                                auVar34._24_8_ = uStack_3e8;
                                if (auVar34 == (undefined1  [32])0x0) {
LAB_01b78900:
                                  *(float *)(ray + k * 4 + 0x100) = fVar234;
                                }
                                else {
                                  p_Var7 = context->args->filter;
                                  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                    (*p_Var7)(&local_490);
                                    auVar46 = vxorps_avx512vl(auVar46,auVar46);
                                    auVar268 = ZEXT1664(auVar46);
                                    auVar264 = ZEXT464(0x3f800000);
                                    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    in_ZMM18 = ZEXT3264(auVar82);
                                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                    auVar263 = ZEXT1664(auVar46);
                                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar269 = ZEXT1664(auVar46);
                                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar265 = ZEXT1664(auVar46);
                                  }
                                  auVar35._8_8_ = uStack_3f8;
                                  auVar35._0_8_ = local_400;
                                  auVar35._16_8_ = uStack_3f0;
                                  auVar35._24_8_ = uStack_3e8;
                                  if (auVar35 == (undefined1  [32])0x0) goto LAB_01b78900;
                                  uVar42 = vptestmd_avx512vl(auVar35,auVar35);
                                  iVar107 = *(int *)(local_490.hit + 4);
                                  iVar267 = *(int *)(local_490.hit + 8);
                                  iVar29 = *(int *)(local_490.hit + 0xc);
                                  iVar30 = *(int *)(local_490.hit + 0x10);
                                  iVar31 = *(int *)(local_490.hit + 0x14);
                                  iVar32 = *(int *)(local_490.hit + 0x18);
                                  iVar33 = *(int *)(local_490.hit + 0x1c);
                                  bVar36 = (byte)uVar42;
                                  bVar17 = (bool)((byte)(uVar42 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar42 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar42 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar42 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar42 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar42 >> 6) & 1);
                                  bVar16 = SUB81(uVar42 >> 7,0);
                                  *(uint *)(local_490.ray + 0x180) =
                                       (uint)(bVar36 & 1) * *(int *)local_490.hit |
                                       (uint)!(bool)(bVar36 & 1) * *(int *)(local_490.ray + 0x180);
                                  *(uint *)(local_490.ray + 0x184) =
                                       (uint)bVar17 * iVar107 |
                                       (uint)!bVar17 * *(int *)(local_490.ray + 0x184);
                                  *(uint *)(local_490.ray + 0x188) =
                                       (uint)bVar11 * iVar267 |
                                       (uint)!bVar11 * *(int *)(local_490.ray + 0x188);
                                  *(uint *)(local_490.ray + 0x18c) =
                                       (uint)bVar12 * iVar29 |
                                       (uint)!bVar12 * *(int *)(local_490.ray + 0x18c);
                                  *(uint *)(local_490.ray + 400) =
                                       (uint)bVar13 * iVar30 |
                                       (uint)!bVar13 * *(int *)(local_490.ray + 400);
                                  *(uint *)(local_490.ray + 0x194) =
                                       (uint)bVar14 * iVar31 |
                                       (uint)!bVar14 * *(int *)(local_490.ray + 0x194);
                                  *(uint *)(local_490.ray + 0x198) =
                                       (uint)bVar15 * iVar32 |
                                       (uint)!bVar15 * *(int *)(local_490.ray + 0x198);
                                  *(uint *)(local_490.ray + 0x19c) =
                                       (uint)bVar16 * iVar33 |
                                       (uint)!bVar16 * *(int *)(local_490.ray + 0x19c);
                                  iVar107 = *(int *)(local_490.hit + 0x24);
                                  iVar267 = *(int *)(local_490.hit + 0x28);
                                  iVar29 = *(int *)(local_490.hit + 0x2c);
                                  iVar30 = *(int *)(local_490.hit + 0x30);
                                  iVar31 = *(int *)(local_490.hit + 0x34);
                                  iVar32 = *(int *)(local_490.hit + 0x38);
                                  iVar33 = *(int *)(local_490.hit + 0x3c);
                                  bVar17 = (bool)((byte)(uVar42 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar42 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar42 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar42 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar42 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar42 >> 6) & 1);
                                  bVar16 = SUB81(uVar42 >> 7,0);
                                  *(uint *)(local_490.ray + 0x1a0) =
                                       (uint)(bVar36 & 1) * *(int *)(local_490.hit + 0x20) |
                                       (uint)!(bool)(bVar36 & 1) * *(int *)(local_490.ray + 0x1a0);
                                  *(uint *)(local_490.ray + 0x1a4) =
                                       (uint)bVar17 * iVar107 |
                                       (uint)!bVar17 * *(int *)(local_490.ray + 0x1a4);
                                  *(uint *)(local_490.ray + 0x1a8) =
                                       (uint)bVar11 * iVar267 |
                                       (uint)!bVar11 * *(int *)(local_490.ray + 0x1a8);
                                  *(uint *)(local_490.ray + 0x1ac) =
                                       (uint)bVar12 * iVar29 |
                                       (uint)!bVar12 * *(int *)(local_490.ray + 0x1ac);
                                  *(uint *)(local_490.ray + 0x1b0) =
                                       (uint)bVar13 * iVar30 |
                                       (uint)!bVar13 * *(int *)(local_490.ray + 0x1b0);
                                  *(uint *)(local_490.ray + 0x1b4) =
                                       (uint)bVar14 * iVar31 |
                                       (uint)!bVar14 * *(int *)(local_490.ray + 0x1b4);
                                  *(uint *)(local_490.ray + 0x1b8) =
                                       (uint)bVar15 * iVar32 |
                                       (uint)!bVar15 * *(int *)(local_490.ray + 0x1b8);
                                  *(uint *)(local_490.ray + 0x1bc) =
                                       (uint)bVar16 * iVar33 |
                                       (uint)!bVar16 * *(int *)(local_490.ray + 0x1bc);
                                  iVar107 = *(int *)(local_490.hit + 0x44);
                                  iVar267 = *(int *)(local_490.hit + 0x48);
                                  iVar29 = *(int *)(local_490.hit + 0x4c);
                                  iVar30 = *(int *)(local_490.hit + 0x50);
                                  iVar31 = *(int *)(local_490.hit + 0x54);
                                  iVar32 = *(int *)(local_490.hit + 0x58);
                                  iVar33 = *(int *)(local_490.hit + 0x5c);
                                  bVar17 = (bool)((byte)(uVar42 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar42 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar42 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar42 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar42 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar42 >> 6) & 1);
                                  bVar16 = SUB81(uVar42 >> 7,0);
                                  *(uint *)(local_490.ray + 0x1c0) =
                                       (uint)(bVar36 & 1) * *(int *)(local_490.hit + 0x40) |
                                       (uint)!(bool)(bVar36 & 1) * *(int *)(local_490.ray + 0x1c0);
                                  *(uint *)(local_490.ray + 0x1c4) =
                                       (uint)bVar17 * iVar107 |
                                       (uint)!bVar17 * *(int *)(local_490.ray + 0x1c4);
                                  *(uint *)(local_490.ray + 0x1c8) =
                                       (uint)bVar11 * iVar267 |
                                       (uint)!bVar11 * *(int *)(local_490.ray + 0x1c8);
                                  *(uint *)(local_490.ray + 0x1cc) =
                                       (uint)bVar12 * iVar29 |
                                       (uint)!bVar12 * *(int *)(local_490.ray + 0x1cc);
                                  *(uint *)(local_490.ray + 0x1d0) =
                                       (uint)bVar13 * iVar30 |
                                       (uint)!bVar13 * *(int *)(local_490.ray + 0x1d0);
                                  *(uint *)(local_490.ray + 0x1d4) =
                                       (uint)bVar14 * iVar31 |
                                       (uint)!bVar14 * *(int *)(local_490.ray + 0x1d4);
                                  *(uint *)(local_490.ray + 0x1d8) =
                                       (uint)bVar15 * iVar32 |
                                       (uint)!bVar15 * *(int *)(local_490.ray + 0x1d8);
                                  *(uint *)(local_490.ray + 0x1dc) =
                                       (uint)bVar16 * iVar33 |
                                       (uint)!bVar16 * *(int *)(local_490.ray + 0x1dc);
                                  iVar107 = *(int *)(local_490.hit + 100);
                                  iVar267 = *(int *)(local_490.hit + 0x68);
                                  iVar29 = *(int *)(local_490.hit + 0x6c);
                                  iVar30 = *(int *)(local_490.hit + 0x70);
                                  iVar31 = *(int *)(local_490.hit + 0x74);
                                  iVar32 = *(int *)(local_490.hit + 0x78);
                                  iVar33 = *(int *)(local_490.hit + 0x7c);
                                  bVar17 = (bool)((byte)(uVar42 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar42 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar42 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar42 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar42 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar42 >> 6) & 1);
                                  bVar16 = SUB81(uVar42 >> 7,0);
                                  *(uint *)(local_490.ray + 0x1e0) =
                                       (uint)(bVar36 & 1) * *(int *)(local_490.hit + 0x60) |
                                       (uint)!(bool)(bVar36 & 1) * *(int *)(local_490.ray + 0x1e0);
                                  *(uint *)(local_490.ray + 0x1e4) =
                                       (uint)bVar17 * iVar107 |
                                       (uint)!bVar17 * *(int *)(local_490.ray + 0x1e4);
                                  *(uint *)(local_490.ray + 0x1e8) =
                                       (uint)bVar11 * iVar267 |
                                       (uint)!bVar11 * *(int *)(local_490.ray + 0x1e8);
                                  *(uint *)(local_490.ray + 0x1ec) =
                                       (uint)bVar12 * iVar29 |
                                       (uint)!bVar12 * *(int *)(local_490.ray + 0x1ec);
                                  *(uint *)(local_490.ray + 0x1f0) =
                                       (uint)bVar13 * iVar30 |
                                       (uint)!bVar13 * *(int *)(local_490.ray + 0x1f0);
                                  *(uint *)(local_490.ray + 500) =
                                       (uint)bVar14 * iVar31 |
                                       (uint)!bVar14 * *(int *)(local_490.ray + 500);
                                  *(uint *)(local_490.ray + 0x1f8) =
                                       (uint)bVar15 * iVar32 |
                                       (uint)!bVar15 * *(int *)(local_490.ray + 0x1f8);
                                  *(uint *)(local_490.ray + 0x1fc) =
                                       (uint)bVar16 * iVar33 |
                                       (uint)!bVar16 * *(int *)(local_490.ray + 0x1fc);
                                  iVar107 = *(int *)(local_490.ray + 0x204);
                                  iVar267 = *(int *)(local_490.ray + 0x208);
                                  iVar29 = *(int *)(local_490.ray + 0x20c);
                                  iVar30 = *(int *)(local_490.ray + 0x210);
                                  iVar31 = *(int *)(local_490.ray + 0x214);
                                  iVar32 = *(int *)(local_490.ray + 0x218);
                                  iVar33 = *(int *)(local_490.ray + 0x21c);
                                  auVar101._0_4_ =
                                       (uint)(bVar36 & 1) * *(int *)(local_490.hit + 0x80) |
                                       (uint)!(bool)(bVar36 & 1) * *(int *)(local_490.ray + 0x200);
                                  bVar17 = (bool)((byte)(uVar42 >> 1) & 1);
                                  auVar101._4_4_ =
                                       (uint)bVar17 * *(int *)(local_490.hit + 0x84) |
                                       (uint)!bVar17 * iVar107;
                                  bVar17 = (bool)((byte)(uVar42 >> 2) & 1);
                                  auVar101._8_4_ =
                                       (uint)bVar17 * *(int *)(local_490.hit + 0x88) |
                                       (uint)!bVar17 * iVar267;
                                  bVar17 = (bool)((byte)(uVar42 >> 3) & 1);
                                  auVar101._12_4_ =
                                       (uint)bVar17 * *(int *)(local_490.hit + 0x8c) |
                                       (uint)!bVar17 * iVar29;
                                  bVar17 = (bool)((byte)(uVar42 >> 4) & 1);
                                  auVar101._16_4_ =
                                       (uint)bVar17 * *(int *)(local_490.hit + 0x90) |
                                       (uint)!bVar17 * iVar30;
                                  bVar17 = (bool)((byte)(uVar42 >> 5) & 1);
                                  auVar101._20_4_ =
                                       (uint)bVar17 * *(int *)(local_490.hit + 0x94) |
                                       (uint)!bVar17 * iVar31;
                                  bVar17 = (bool)((byte)(uVar42 >> 6) & 1);
                                  auVar101._24_4_ =
                                       (uint)bVar17 * *(int *)(local_490.hit + 0x98) |
                                       (uint)!bVar17 * iVar32;
                                  bVar17 = SUB81(uVar42 >> 7,0);
                                  auVar101._28_4_ =
                                       (uint)bVar17 * *(int *)(local_490.hit + 0x9c) |
                                       (uint)!bVar17 * iVar33;
                                  *(undefined1 (*) [32])(local_490.ray + 0x200) = auVar101;
                                  bVar17 = (bool)((byte)(uVar42 >> 1) & 1);
                                  uVar106 = bVar17 * auVar101._4_4_ | (uint)!bVar17 * iVar107;
                                  auVar25._4_24_ = auVar101._8_24_;
                                  auVar25._0_4_ = uVar106;
                                  auVar102._0_8_ = auVar25._0_8_ << 0x20;
                                  bVar17 = (bool)((byte)(uVar42 >> 2) & 1);
                                  auVar102._8_4_ = bVar17 * auVar101._8_4_ | (uint)!bVar17 * iVar267
                                  ;
                                  bVar17 = (bool)((byte)(uVar42 >> 3) & 1);
                                  auVar102._12_4_ =
                                       bVar17 * auVar101._12_4_ | (uint)!bVar17 * iVar29;
                                  bVar17 = (bool)((byte)(uVar42 >> 4) & 1);
                                  auVar102._16_4_ =
                                       bVar17 * auVar101._16_4_ | (uint)!bVar17 * iVar30;
                                  bVar17 = (bool)((byte)(uVar42 >> 5) & 1);
                                  auVar102._20_4_ =
                                       bVar17 * auVar101._20_4_ | (uint)!bVar17 * iVar31;
                                  bVar17 = (bool)((byte)(uVar42 >> 6) & 1);
                                  auVar102._24_4_ =
                                       bVar17 * auVar101._24_4_ | (uint)!bVar17 * iVar32;
                                  bVar17 = SUB81(uVar42 >> 7,0);
                                  auVar102._28_4_ =
                                       bVar17 * auVar101._28_4_ | (uint)!bVar17 * iVar33;
                                  auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                                (local_490.hit + 0xa0));
                                  *(undefined1 (*) [32])(local_490.ray + 0x220) = auVar82;
                                  bVar17 = (bool)((byte)(uVar42 >> 1) & 1);
                                  uVar106 = bVar17 * uVar106 | (uint)!bVar17 * iVar107;
                                  auVar26._4_24_ = auVar102._8_24_;
                                  auVar26._0_4_ = uVar106;
                                  auVar103._0_8_ = auVar26._0_8_ << 0x20;
                                  bVar17 = (bool)((byte)(uVar42 >> 2) & 1);
                                  auVar103._8_4_ = bVar17 * auVar102._8_4_ | (uint)!bVar17 * iVar267
                                  ;
                                  bVar17 = (bool)((byte)(uVar42 >> 3) & 1);
                                  auVar103._12_4_ =
                                       bVar17 * auVar102._12_4_ | (uint)!bVar17 * iVar29;
                                  bVar17 = (bool)((byte)(uVar42 >> 4) & 1);
                                  auVar103._16_4_ =
                                       bVar17 * auVar102._16_4_ | (uint)!bVar17 * iVar30;
                                  bVar17 = (bool)((byte)(uVar42 >> 5) & 1);
                                  auVar103._20_4_ =
                                       bVar17 * auVar102._20_4_ | (uint)!bVar17 * iVar31;
                                  bVar17 = (bool)((byte)(uVar42 >> 6) & 1);
                                  auVar103._24_4_ =
                                       bVar17 * auVar102._24_4_ | (uint)!bVar17 * iVar32;
                                  bVar17 = SUB81(uVar42 >> 7,0);
                                  auVar103._28_4_ =
                                       bVar17 * auVar102._28_4_ | (uint)!bVar17 * iVar33;
                                  auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                                (local_490.hit + 0xc0));
                                  *(undefined1 (*) [32])(local_490.ray + 0x240) = auVar82;
                                  bVar17 = (bool)((byte)(uVar42 >> 1) & 1);
                                  uVar106 = bVar17 * uVar106 | (uint)!bVar17 * iVar107;
                                  auVar27._4_24_ = auVar103._8_24_;
                                  auVar27._0_4_ = uVar106;
                                  auVar104._0_8_ = auVar27._0_8_ << 0x20;
                                  bVar17 = (bool)((byte)(uVar42 >> 2) & 1);
                                  auVar104._8_4_ = bVar17 * auVar103._8_4_ | (uint)!bVar17 * iVar267
                                  ;
                                  bVar17 = (bool)((byte)(uVar42 >> 3) & 1);
                                  auVar104._12_4_ =
                                       bVar17 * auVar103._12_4_ | (uint)!bVar17 * iVar29;
                                  bVar17 = (bool)((byte)(uVar42 >> 4) & 1);
                                  auVar104._16_4_ =
                                       bVar17 * auVar103._16_4_ | (uint)!bVar17 * iVar30;
                                  bVar17 = (bool)((byte)(uVar42 >> 5) & 1);
                                  auVar104._20_4_ =
                                       bVar17 * auVar103._20_4_ | (uint)!bVar17 * iVar31;
                                  bVar17 = (bool)((byte)(uVar42 >> 6) & 1);
                                  auVar104._24_4_ =
                                       bVar17 * auVar103._24_4_ | (uint)!bVar17 * iVar32;
                                  bVar17 = SUB81(uVar42 >> 7,0);
                                  auVar104._28_4_ =
                                       bVar17 * auVar103._28_4_ | (uint)!bVar17 * iVar33;
                                  auVar82 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                                (local_490.hit + 0xe0));
                                  *(undefined1 (*) [32])(local_490.ray + 0x260) = auVar82;
                                  bVar17 = (bool)((byte)(uVar42 >> 1) & 1);
                                  auVar28._4_24_ = auVar104._8_24_;
                                  auVar28._0_4_ = bVar17 * uVar106 | (uint)!bVar17 * iVar107;
                                  auVar105._0_8_ = auVar28._0_8_ << 0x20;
                                  bVar17 = (bool)((byte)(uVar42 >> 2) & 1);
                                  auVar105._8_4_ = bVar17 * auVar104._8_4_ | (uint)!bVar17 * iVar267
                                  ;
                                  bVar17 = (bool)((byte)(uVar42 >> 3) & 1);
                                  auVar105._12_4_ =
                                       bVar17 * auVar104._12_4_ | (uint)!bVar17 * iVar29;
                                  bVar17 = (bool)((byte)(uVar42 >> 4) & 1);
                                  auVar105._16_4_ =
                                       bVar17 * auVar104._16_4_ | (uint)!bVar17 * iVar30;
                                  bVar17 = (bool)((byte)(uVar42 >> 5) & 1);
                                  auVar105._20_4_ =
                                       bVar17 * auVar104._20_4_ | (uint)!bVar17 * iVar31;
                                  bVar17 = (bool)((byte)(uVar42 >> 6) & 1);
                                  auVar105._24_4_ =
                                       bVar17 * auVar104._24_4_ | (uint)!bVar17 * iVar32;
                                  bVar17 = SUB81(uVar42 >> 7,0);
                                  auVar105._28_4_ =
                                       bVar17 * auVar104._28_4_ | (uint)!bVar17 * iVar33;
                                  auVar82._16_16_ = auVar105._16_16_;
                                  auVar76 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                                (local_490.hit + 0x100));
                                  *(undefined1 (*) [32])(local_490.ray + 0x280) = auVar76;
                                }
                                auVar262 = ZEXT1664(auVar48);
                                auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar266 = ZEXT1664(auVar46);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar41 = lVar41 + -1;
              } while (lVar41 != 0);
            }
          }
          else {
            auVar46 = vxorps_avx512vl(ZEXT416(5),auVar53);
            auVar268 = ZEXT1664(auVar46);
          }
        }
      }
    } while (bVar10);
    auVar46 = vinsertps_avx512f(auVar54,auVar57,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }